

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O1

void search_tx_type(AV1_COMP *cpi,MACROBLOCK *x,int plane,int block,int blk_row,int blk_col,
                   BLOCK_SIZE plane_bsize,TX_SIZE tx_size,TXB_CTX *txb_ctx,
                   FAST_TX_SEARCH_MODE ftxs_mode,int skip_trellis,int64_t ref_best_rd,
                   RD_STATS *best_rd_stats)

{
  AV1_COMMON *cm;
  macroblock_plane *pmVar1;
  int16_t *piVar2;
  uint8_t uVar3;
  byte bVar4;
  short sVar5;
  short sVar6;
  undefined4 uVar7;
  MB_MODE_INFO *pMVar8;
  short *psVar9;
  MB_MODE_INFO *pMVar10;
  AV1_PRIMARY *pAVar11;
  NN_CONFIG *pNVar12;
  NN_CONFIG *pNVar13;
  uint16_t *puVar14;
  byte bVar15;
  undefined1 auVar16 [12];
  undefined1 auVar17 [12];
  undefined1 auVar18 [16];
  undefined1 auVar19 [12];
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  AV1_COMP *pAVar22;
  bool bVar23;
  _Bool _Var24;
  ushort uVar25;
  int i;
  int iVar26;
  int iVar27;
  int iVar28;
  ushort *puVar29;
  CommonQuantParams *pCVar30;
  long lVar31;
  int64_t iVar32;
  byte *pbVar33;
  byte bVar34;
  float fVar35;
  uint uVar36;
  CommonQuantParams *pCVar37;
  int64_t *piVar38;
  uint8_t uVar39;
  ulong uVar40;
  TX_TYPE TVar41;
  uint uVar42;
  char cVar43;
  float fVar44;
  float fVar45;
  int *piVar46;
  uint *puVar47;
  long lVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  long lVar52;
  CommonQuantParams *pCVar53;
  float fVar54;
  PREDICTION_MODE *pPVar55;
  int16_t *piVar56;
  float fVar57;
  ulong uVar58;
  long lVar59;
  float fVar60;
  float fVar61;
  ulong uVar62;
  CommonQuantParams *pCVar63;
  ulong uVar64;
  int idx;
  uint uVar65;
  long lVar66;
  QUANT_PARAM *__s;
  tran_low_t *ptVar67;
  float fVar68;
  long lVar69;
  bool bVar70;
  bool bVar71;
  bool bVar72;
  uint uVar73;
  uint uVar74;
  uint uVar75;
  int iVar76;
  float fVar77;
  double dVar78;
  int iVar81;
  int iVar82;
  int iVar83;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar84 [16];
  float fVar85;
  float fVar86;
  float fVar87;
  int iVar94;
  int iVar96;
  int iVar97;
  int aiVar88 [4];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar95;
  undefined1 auVar93 [16];
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar105;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  float fVar110;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined8 uVar114;
  undefined1 auVar113 [16];
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar122;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  float fVar123;
  float fVar124;
  float fVar125;
  TX_SIZE TVar126;
  ulong local_730;
  int64_t dist;
  undefined8 uStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  CommonQuantParams *local_6e8;
  AV1_COMP *local_6e0;
  undefined8 local_6d8;
  float local_6d0;
  float local_6cc;
  TxfmParam txfm_param_2;
  undefined8 uStack_6b0;
  uint64_t local_660;
  uint block_mse_q8;
  undefined8 local_618;
  uint uStack_610;
  uint uStack_60c;
  int rate_cost;
  tran_low_t **local_5f8;
  int16_t *local_5f0;
  ulong local_5e8;
  long local_5e0;
  undefined8 local_5d8;
  float fStack_5d0;
  float fStack_5cc;
  MACROBLOCKD *local_5c8;
  undefined8 local_5c0;
  ENTROPY_CONTEXT ctxl [32];
  uint7 uStack_597;
  byte local_570;
  int64_t local_560;
  int64_t dist_1;
  TxfmParam txfm_param;
  int idx_h [4];
  int idx_v [4];
  long local_4d8;
  undefined8 local_4d0;
  undefined8 local_4c8;
  int64_t iStack_4c0;
  int64_t local_4b8;
  int64_t iStack_4b0;
  int64_t local_4a8;
  int64_t iStack_4a0;
  int64_t local_498;
  int64_t iStack_490;
  long local_488;
  int64_t sse;
  int skip_h [4];
  int skip_v [4];
  tran_low_t *local_440;
  QUANT_PARAM quant_param;
  
  pMVar8 = *(x->e_mbd).mi;
  rate_cost = 0;
  lVar66 = (long)plane;
  if (plane == 0) {
    local_4d8 = (long)((x->e_mbd).tx_type_map_stride * blk_row + blk_col);
  }
  else {
    local_4d8 = 0;
  }
  pmVar1 = x->plane + lVar66;
  local_440 = x->plane[lVar66].dqcoeff;
  local_4d0 = x->dqcoeff_buf;
  best_rd_stats->rate = 0x7fffffff;
  best_rd_stats->zero_rate = 0;
  best_rd_stats->dist = 0x7fffffffffffffff;
  best_rd_stats->rdcost = 0x7fffffffffffffff;
  best_rd_stats->sse = 0x7fffffffffffffff;
  best_rd_stats->skip_txfm = '\0';
  bVar72 = (cpi->optimize_seg_arr[*(ushort *)&pMVar8->field_0xa7 & 7] & 0xfd) != 0;
  local_498 = 0xd0000000c;
  iStack_490 = 0xf0000000e;
  local_4a8 = 0x900000008;
  iStack_4a0 = 0xb0000000a;
  local_4b8 = 0x500000004;
  iStack_4b0 = 0x700000006;
  local_4c8 = 0x100000000;
  iStack_4c0 = 0x300000002;
  bVar34 = 3;
  if ((((x->e_mbd).cur_buf)->flags & 8) != 0) {
    bVar34 = (char)(x->e_mbd).bd - 5;
  }
  psVar9 = pmVar1->dequant_QTX;
  local_5e0 = CONCAT44(local_5e0._4_4_,(int)psVar9[1] >> (bVar34 & 0x1f));
  local_730 = (ulong)tx_size;
  uVar40 = (ulong)plane_bsize;
  local_6e0 = cpi;
  local_488 = lVar66;
  if ((((x->txfm_search_params).predict_dc_level == 0) ||
      ((0x3efefUL >> (local_730 & 0x3f) & 1) == 0)) || ((0x5f7efUL >> (local_730 & 0x3f) & 1) == 0))
  {
    local_660 = av1_pixel_diff_dist(x,plane,blk_row,blk_col,plane_bsize,txsize_to_bsize[local_730],
                                    &block_mse_q8);
    iVar26 = 0;
    local_560 = 0x7fffffffffffffff;
  }
  else {
    bVar34 = 3;
    if ((((x->e_mbd).cur_buf)->flags & 8) != 0) {
      bVar34 = (char)(x->e_mbd).bd - 5;
    }
    sVar5 = psVar9[1];
    bVar4 = block_size_high[txsize_to_bsize[local_730]];
    iVar26 = (x->e_mbd).mb_to_bottom_edge;
    uVar65 = (uint)bVar4;
    if (iVar26 < 0) {
      bVar15 = (char)(x->e_mbd).plane[lVar66].subsampling_y + 3U & 0x1f;
      uVar36 = (uint)block_size_high[uVar40] + blk_row * -4 + (iVar26 >> bVar15);
      if ((int)uVar36 < (int)(uint)bVar4) {
        uVar65 = uVar36;
      }
      if ((int)uVar36 < 0) {
        uVar65 = 0 >> bVar15;
      }
    }
    uVar36 = (uint)block_size_wide[txsize_to_bsize[local_730]];
    iVar26 = (x->e_mbd).mb_to_right_edge;
    if (iVar26 < 0) {
      bVar4 = (char)(x->e_mbd).plane[lVar66].subsampling_x + 3U & 0x1f;
      uVar42 = (uint)block_size_wide[uVar40] + blk_col * -4 + (iVar26 >> bVar4);
      if ((int)uVar42 < (int)(uint)block_size_wide[txsize_to_bsize[local_730]]) {
        uVar36 = uVar42;
      }
      if ((int)uVar42 < 0) {
        uVar36 = 0 >> bVar4;
      }
    }
    sVar6 = *psVar9;
    quant_param.log_scale = 0;
    local_660 = (*aom_sum_sse_2d_i16)
                          (pmVar1->src_diff +
                           (int)(((uint)block_size_wide[uVar40] * blk_row + blk_col) * 4),
                           (uint)block_size_wide[uVar40],uVar36,uVar65,&quant_param.log_scale);
    if (((int)uVar36 < 1) || ((int)uVar65 < 1)) {
      block_mse_q8 = 0xffffffff;
      uVar58 = 0xffffffffffffffff;
      local_560 = 0x7fffffffffffffff;
    }
    else {
      iVar26 = -quant_param.log_scale;
      if (0 < quant_param.log_scale) {
        iVar26 = quant_param.log_scale;
      }
      dVar78 = 1.0 / (double)(int)(uVar36 * uVar65);
      local_560 = (long)((double)iVar26 * dVar78) * -0x80;
      if (0 < quant_param.log_scale) {
        local_560 = (long)((double)iVar26 * dVar78) * 0x80;
      }
      auVar108._8_4_ = (int)(local_660 >> 0x18);
      auVar108._0_8_ = local_660 << 8;
      auVar108._12_4_ = 0x45300000;
      block_mse_q8 = (uint)(long)(((auVar108._8_8_ - 1.9342813113834067e+25) +
                                  ((double)CONCAT44(0x43300000,(int)(local_660 << 8)) -
                                  4503599627370496.0)) * dVar78);
      dVar78 = dVar78 * (double)quant_param.log_scale * (double)quant_param.log_scale;
      uVar58 = (ulong)dVar78;
      uVar58 = local_660 - ((long)(dVar78 - 9.223372036854776e+18) & (long)uVar58 >> 0x3f | uVar58);
    }
    dVar78 = (double)((int)sVar5 >> (bVar34 & 0x1f));
    dVar78 = dVar78 * 1.8 * dVar78;
    uVar62 = (ulong)dVar78;
    uVar65 = ((x->e_mbd).cur_buf)->flags;
    if ((uVar65 & 8) != 0) {
      bVar34 = (char)(x->e_mbd).bd * '\x02' - 0x10;
      uVar58 = uVar58 + ((uint)(1 << (bVar34 & 0x1f)) >> 1) >> (bVar34 & 0x3f);
    }
    iVar27 = 0;
    iVar26 = iVar27;
    if (uVar58 < ((long)(dVar78 - 9.223372036854776e+18) & (long)uVar62 >> 0x3f | uVar62)) {
      lVar52 = -local_560;
      if (0 < local_560) {
        lVar52 = local_560;
      }
      if ((long)((ulong)dc_coeff_scale[local_730] * lVar52) < (long)(((int)sVar6 >> 3) << 0xc)) {
        best_rd_stats->skip_txfm = '\x01';
        local_5c0 = (long)block;
        pmVar1->eobs[local_5c0] = 0;
        if ((uVar65 & 8) != 0) {
          bVar34 = (char)(x->e_mbd).bd * '\x02' - 0x10;
          local_660 = (long)(local_660 + ((uint)(1 << (bVar34 & 0x1f)) >> 1)) >> (bVar34 & 0x3f);
        }
        best_rd_stats->dist = local_660 << 4;
        best_rd_stats->sse = local_660 << 4;
        av1_get_entropy_contexts
                  (plane_bsize,(macroblockd_plane *)&(x->e_mbd).plane[lVar66].plane_type,
                   (ENTROPY_CONTEXT *)&quant_param,ctxl);
        bVar34 = ""[local_730];
        bVar4 = ""[local_730];
        get_txb_ctx(plane_bsize,(TX_SIZE)local_730,plane,(ENTROPY_CONTEXT *)&quant_param,ctxl,
                    (TXB_CTX *)&txfm_param);
        iVar26 = (x->coeff_costs).coeff_costs[(uint)bVar34 + (uint)bVar4 + 1 >> 1 & 0xff]
                 [plane != 0].txb_skip_cost[(int)txfm_param._0_4_][1];
        best_rd_stats->rate = iVar26;
        best_rd_stats->rdcost =
             best_rd_stats->sse * 0x80 + ((long)x->rdmult * (long)iVar26 + 0x100 >> 9);
        pmVar1->txb_entropy_ctx[local_5c0] = '\0';
        iVar26 = 0;
      }
      else if ((1 < (x->txfm_search_params).predict_dc_level) &&
              ((plane == 0 ||
               ((iVar26 = 0, 0 < plane &&
                (((pMVar8->field_0xa7 & 0x80) != 0 || (iVar26 = iVar27, '\0' < pMVar8->ref_frame[0])
                 ))))))) {
        iVar26 = 1;
      }
    }
    if (best_rd_stats->skip_txfm == '\x01') {
      if (plane != 0) {
        return;
      }
      (x->e_mbd).tx_type_map[local_4d8] = '\0';
      return;
    }
  }
  cm = &local_6e0->common;
  local_5c8 = &x->e_mbd;
  uVar65 = 1;
  local_5c0 = CONCAT44(local_5c0._4_4_,iVar26);
  if (iVar26 == 0) {
    if ((local_6e0->sf).rt_sf.dct_only_palette_nonrd == 1) {
      bVar71 = false;
    }
    else {
      pMVar10 = *(x->e_mbd).mi;
      local_6e8 = (CommonQuantParams *)0x1;
      cVar43 = (char)*(ushort *)&pMVar10->field_0xa7;
      if (-1 < cVar43) {
        local_6e8 = (CommonQuantParams *)(ulong)('\0' < pMVar10->ref_frame[0]);
      }
      pAVar11 = local_6e0->ppi;
      local_618 = (tran_low_t *)(ulong)(pAVar11->gf_group).update_type[local_6e0->gf_frame_index];
      iVar27 = (int)local_730;
      piVar46 = (int *)((long)(pAVar11->frame_probs).tx_type_probs[(long)local_618][0] +
                       (ulong)(uint)(iVar27 << 6));
      iVar26 = (int)local_6e8;
      uVar65 = (uint)*(ushort *)&pMVar10->field_0xa7;
      if (iVar26 == 0) {
        if ((x->txfm_search_params).use_default_intra_tx_type == 0) goto LAB_0023c701;
LAB_0023c6ed:
        if ((cVar43 < '\0') || ('\0' < pMVar10->ref_frame[0])) {
          bVar34 = 0;
        }
        else {
          bVar34 = 0;
          if ((tx_size < 3) &&
             (local_6e0->use_screen_content_tools == 0 && (x->e_mbd).lossless[uVar65 & 7] == 0)) {
            bVar34 = intra_mode_to_tx_type__intra_mode_to_tx_type[pMVar10->mode];
          }
        }
      }
      else {
        iVar28 = (x->txfm_search_params).default_inter_tx_type_prob_thresh;
        if (iVar28 == 0x7fffffff) {
LAB_0023c701:
          bVar34 = 0x10;
          if (plane == 0) {
            bVar34 = (x->rd_model != '\x01') << 4;
          }
        }
        else {
          if (iVar28 == 0) goto LAB_0023c6ed;
          bVar34 = 0;
          if (*piVar46 <= iVar28) {
            uVar58 = 0;
            uVar62 = 0;
            iVar76 = 0;
            do {
              iVar81 = *(int *)((long)(pAVar11->frame_probs).tx_type_probs[(long)local_618][0] +
                               uVar62 * 4 + (ulong)(uint)(iVar27 << 6) + 4);
              uVar62 = uVar62 + 1;
              if (iVar76 < iVar81) {
                uVar58 = uVar62 & 0xffffffff;
                iVar76 = iVar81;
              }
            } while (uVar62 != 0xf);
            bVar34 = (byte)uVar58;
            if (iVar76 <= iVar28 + 100) {
              bVar34 = 0x10;
              if (plane == 0) {
                bVar34 = (x->rd_model != '\x01') << 4;
              }
            }
          }
        }
      }
      _Var24 = (local_6e0->common).features.reduced_tx_set_used;
      local_6d8 = (ulong)_Var24;
      bVar4 = (byte)local_730;
      uVar58 = 0x61810L >> (bVar4 & 0x3f);
      if ((0x61810UL >> (local_730 & 0x3f) & 1) == 0) {
        if ((0x18608UL >> (local_730 & 0x3f) & 1) == 0) {
          if (_Var24 == false) {
            local_6e8 = (CommonQuantParams *)
                        CONCAT71(0x606,av1_ext_tx_set_lookup[0]
                                       [(ulong)((0x60604UL >> (local_730 & 0x3f) & 1) != 0) +
                                        (ulong)(uint)(iVar26 * 2)]);
          }
          else {
            local_6e8 = (CommonQuantParams *)(ulong)(byte)((iVar26 == 0) + 1);
          }
        }
      }
      else {
        local_6e8 = (CommonQuantParams *)0x0;
      }
      if (plane == 0) {
        uVar36 = 0;
      }
      else {
        uVar36 = 0;
        if ((uVar58 & 1) == 0) {
          bVar34 = 0;
          if ((x->e_mbd).lossless[uVar65 & 7] == 0) {
            if ((cVar43 < '\0') || ('\0' < pMVar10->ref_frame[0])) {
              pbVar33 = (x->e_mbd).tx_type_map +
                        ((blk_row << ((byte)(x->e_mbd).plane[1].subsampling_y & 0x1f)) *
                         (x->e_mbd).tx_type_map_stride +
                        (blk_col << ((byte)(x->e_mbd).plane[1].subsampling_x & 0x1f)));
            }
            else {
              pbVar33 = intra_mode_to_tx_type__intra_mode_to_tx_type +
                        (byte)get_uv_mode_uv2y[pMVar10->uv_mode];
            }
            uVar36 = 1;
            if (-1 < cVar43) {
              uVar36 = (uint)('\0' < pMVar10->ref_frame[0]);
            }
            if ((0x18608UL >> (local_730 & 0x3f) & 1) == 0) {
              if (_Var24 == false) {
                uVar36 = (uint)av1_ext_tx_set_lookup[0]
                               [(ulong)((0x60604UL >> (local_730 & 0x3f) & 1) != 0) +
                                (ulong)(uVar36 * 2)];
              }
              else {
                uVar36 = (uint)(byte)((uVar36 == 0) + 1);
              }
            }
            uVar36 = *(uint *)((long)av1_ext_tx_used[0] + (ulong)*pbVar33 * 4 + (ulong)(uVar36 << 6)
                              );
            if (uVar36 != 0) {
              uVar36 = (uint)*pbVar33;
            }
            bVar34 = (byte)uVar36;
          }
        }
        else {
          bVar34 = 0;
        }
      }
      local_5e8 = CONCAT44(local_5e8._4_4_,uVar36);
      if ((pMVar10->filter_intra_mode_info).use_filter_intra == '\0') {
        pPVar55 = &pMVar10->mode;
      }
      else {
        pPVar55 = "" + (pMVar10->filter_intra_mode_info).filter_intra_mode;
      }
      iVar28 = (local_6e0->sf).tx_sf.tx_type_search.use_reduced_intra_txset;
      local_5d8 = (ulong)local_6e8 & 0xff;
      puVar29 = av1_reduced_intra_tx_used_flag + *pPVar55;
      if ((char)local_6e8 != '\x03') {
        puVar29 = av1_ext_tx_used_flag + local_5d8;
      }
      if (iVar28 == 0) {
        puVar29 = av1_ext_tx_used_flag + local_5d8;
      }
      uVar25 = *puVar29;
      if (iVar28 == 2) {
        uVar25 = uVar25 & av1_derived_intra_tx_used_flag[*pPVar55];
      }
      if ((((uVar58 & 1) == 0) && ((x->e_mbd).lossless[uVar65 & 7] == 0)) && (uVar25 != 1)) {
        if (iVar26 == 0) {
          if ((local_6e0->oxcf).txfm_cfg.use_intra_dct_only == true) goto LAB_0023c9d0;
        }
        else if ((local_6e0->oxcf).txfm_cfg.use_inter_dct_only != false) goto LAB_0023c9d0;
      }
      else {
LAB_0023c9d0:
        bVar34 = 0;
      }
      uVar65 = uVar25 & 0xf;
      if ((local_6e0->oxcf).txfm_cfg.enable_flip_idtx != false) {
        uVar65 = (uint)uVar25;
      }
      if (bVar34 < 0x10) {
        uVar65 = uVar65 & 1 << (bVar34 & 0x1f);
      }
      else if ((ftxs_mode & 1) == 0) {
        lVar52 = (long)(local_6e0->sf).tx_sf.tx_type_search.prune_tx_type_using_stats;
        if (lVar52 != 0) {
          iVar28 = -1;
          uVar62 = 0;
          uVar58 = 0;
          uVar36 = 0;
          do {
            iVar76 = piVar46[uVar62];
            if ((iVar28 < iVar76) && ((uVar65 >> ((uint)uVar62 & 0x1f) & 1) != 0)) {
              uVar58 = uVar62 & 0xffffffff;
              iVar28 = iVar76;
            }
            uVar42 = 1 << ((byte)uVar62 & 0x1f);
            if (*(int *)(lVar52 * 0x1c + 0x506eb4 + (long)local_618 * 4) <= iVar76) {
              uVar42 = 0;
            }
            uVar36 = uVar36 | uVar42;
            uVar62 = uVar62 + 1;
          } while (uVar62 != 0x10);
          bVar15 = (byte)uVar58 & 0x1f;
          uVar42 = 0xffff;
          if (((uVar36 & 0xffff) >> ((uint)uVar58 & 0x1f) & 1) != 0) {
            uVar42 = -2 << bVar15 | 0xfffffffeU >> 0x20 - bVar15;
          }
          uVar65 = uVar65 & ~(uVar42 & uVar36);
        }
        iVar76 = 0;
        iVar81 = 0;
        iVar82 = 0;
        iVar83 = 0;
        iVar28 = 0x10;
        aiVar88 = quad_to_linear_1;
        do {
          auVar108 = pshuflw(in_XMM5,(undefined1  [16])aiVar88,0xfe);
          lVar52 = auVar108._0_8_;
          auVar111._0_4_ = uVar65 >> lVar52;
          auVar111._4_4_ = uVar65 >> lVar52;
          auVar111._8_4_ = uVar65 >> lVar52;
          auVar111._12_4_ = uVar65 >> lVar52;
          auVar108 = pshuflw(auVar108,(undefined1  [16])aiVar88,0x54);
          iVar94 = aiVar88[1];
          iVar96 = aiVar88[2];
          iVar97 = aiVar88[3];
          auVar109._0_8_ = aiVar88._8_8_;
          auVar109._8_4_ = iVar96;
          auVar109._12_4_ = iVar97;
          auVar112 = pshuflw(auVar111,auVar109,0xfe);
          in_XMM5 = pshuflw(auVar109,auVar109,0x54);
          iVar76 = iVar76 + (uVar65 >> auVar108._0_8_ & 1);
          iVar81 = iVar81 + (auVar111._4_4_ & 1);
          iVar82 = iVar82 + (uVar65 >> in_XMM5._0_8_ & 1);
          iVar83 = iVar83 + (uVar65 >> auVar112._0_8_ & 1);
          aiVar88[0] = aiVar88[0] + 4;
          aiVar88[1] = iVar94 + 4;
          aiVar88[2] = iVar96 + 4;
          aiVar88[3] = iVar97 + 4;
          iVar28 = iVar28 + -4;
        } while (iVar28 != 0);
        uVar36 = iVar83 + iVar81 + iVar82 + iVar76;
        local_618 = (tran_low_t *)(ulong)uVar65;
        if ((uVar36 < 3) || ((local_6e0->sf).tx_sf.tx_type_search.prune_tx_type_est_rd == 0)) {
          uVar42 = (x->txfm_search_params).prune_2d_txfm_mode;
          if ((0 < (int)uVar42 && iVar26 != 0) &&
             ((((uint)((int)uVar42 < 4) * 4 + 1 < uVar36 && (0xfd < (byte)((char)local_6e8 - 6U)))
              && ((0x61e7UL >> (local_730 & 0x3f) & 1) != 0)))) {
            pNVar12 = *(NN_CONFIG **)
                       ((long)av1_tx_type_nnconfig_map_hor + (ulong)(uint)(iVar27 * 8));
            uVar65 = *(uint *)((long)tx_size_wide + (ulong)(uint)(iVar27 * 4));
            local_6cc = (float)(uVar65 >> (~(byte)(0xa0e3L >> (bVar4 & 0x3f)) & 1));
            uVar36 = *(uint *)((long)tx_size_high + (ulong)(uint)(iVar27 * 4));
            local_6d8 = (ulong)uVar36;
            bVar15 = block_size_wide[uVar40];
            bVar71 = (0x6be9cUL >> (local_730 & 0x3f) & 1) != 0;
            iVar28 = (int)uVar65 >> ((0x75f1cUL >> (local_730 & 0x3f) & 1) != 0);
            pNVar13 = *(NN_CONFIG **)
                       ((long)av1_tx_type_nnconfig_map_ver + (ulong)(uint)(iVar27 * 8));
            local_5f0 = x->plane[0].src_diff;
            iVar26 = (int)uVar36 >> bVar71;
            local_6d0 = (float)(iVar26 * iVar28);
            __s = &quant_param;
            local_5f8 = (tran_low_t **)(ulong)uVar42;
            memset(__s,0,(long)(int)local_6d0 << 2);
            lVar52 = (long)(int)(blk_row * (uint)bVar15 * 4);
            piVar2 = local_5f0 + lVar52 + blk_col * 4;
            if ((0x75f1cUL >> (local_730 & 0x3f) & 1) == 0) {
              uVar58 = 0;
              piVar56 = piVar2;
              do {
                uVar62 = 0;
                do {
                  (&quant_param.log_scale)[(long)(int)(((uint)uVar58 >> bVar71) * iVar28) + uVar62]
                       = (&quant_param.log_scale)
                         [(long)(int)(((uint)uVar58 >> bVar71) * iVar28) + uVar62] +
                         (int)piVar56[uVar62] * (int)piVar56[uVar62];
                  uVar62 = uVar62 + 1;
                } while (uVar65 != uVar62);
                uVar58 = uVar58 + 1;
                piVar56 = (int16_t *)((long)piVar56 + (ulong)((uint)bVar15 * 2));
              } while (uVar58 != local_6d8);
            }
            else {
              piVar56 = local_5f0 + lVar52 + (long)(blk_col * 4) + 1;
              uVar58 = 0;
              do {
                uVar42 = ((uint)uVar58 >> bVar71) * iVar28;
                uVar62 = 0;
                do {
                  *(int *)((long)&quant_param.log_scale + uVar62 * 2 + (ulong)uVar42 * 4) =
                       (int)piVar56[uVar62 - 1] * (int)piVar56[uVar62 - 1] +
                       *(int *)((long)&quant_param.log_scale + uVar62 * 2 + (ulong)uVar42 * 4) +
                       (int)piVar56[uVar62] * (int)piVar56[uVar62];
                  uVar62 = uVar62 + 2;
                } while (uVar62 < uVar65);
                uVar58 = uVar58 + 1;
                piVar56 = (int16_t *)((long)piVar56 + (ulong)((uint)bVar15 * 2));
              } while (uVar58 != local_6d8);
            }
            iVar27 = (int)local_6d8;
            if ((int)local_6d0 < 1) {
              uVar58 = 0;
            }
            else {
              uVar62 = 0;
              uVar58 = 0;
              do {
                uVar58 = uVar58 + (uint)(&quant_param.log_scale)[uVar62];
                uVar62 = uVar62 + 1;
              } while ((uint)local_6d0 != uVar62);
            }
            if (uVar58 == 0) {
              if (1 < iVar28) {
                fVar77 = 1.0 / (float)iVar28;
                lVar52 = (ulong)(iVar28 - 1) - 1;
                auVar89._8_4_ = (int)lVar52;
                auVar89._0_8_ = lVar52;
                auVar89._12_4_ = (int)((ulong)lVar52 >> 0x20);
                uVar58 = 0;
                auVar89 = auVar89 ^ _DAT_004cb3e0;
                auVar112 = _DAT_004cb3c0;
                auVar106 = _DAT_004cb3d0;
                do {
                  auVar108 = auVar106 ^ _DAT_004cb3e0;
                  iVar76 = auVar89._4_4_;
                  if ((bool)(~(auVar108._4_4_ == iVar76 && auVar89._0_4_ < auVar108._0_4_ ||
                              iVar76 < auVar108._4_4_) & 1)) {
                    *(float *)(ctxl + uVar58) = fVar77;
                  }
                  if ((auVar108._12_4_ != auVar89._12_4_ || auVar108._8_4_ <= auVar89._8_4_) &&
                      auVar108._12_4_ <= auVar89._12_4_) {
                    *(float *)(ctxl + uVar58 + 4) = fVar77;
                  }
                  iVar81 = SUB164(auVar112 ^ _DAT_004cb3e0,4);
                  if (iVar81 <= iVar76 &&
                      (iVar81 != iVar76 || SUB164(auVar112 ^ _DAT_004cb3e0,0) <= auVar89._0_4_)) {
                    *(float *)(ctxl + uVar58 + 8) = fVar77;
                    *(float *)(ctxl + uVar58 + 0xc) = fVar77;
                  }
                  lVar52 = auVar106._8_8_;
                  auVar106._0_8_ = auVar106._0_8_ + 4;
                  auVar106._8_8_ = lVar52 + 4;
                  lVar52 = auVar112._8_8_;
                  auVar112._0_8_ = auVar112._0_8_ + 4;
                  auVar112._8_8_ = lVar52 + 4;
                  uVar58 = uVar58 + 0x10;
                } while (((ulong)(iVar28 - 1) * 4 + 0xc & 0xfffffffffffffff0) != uVar58);
              }
              if (1 < iVar26) {
                fVar77 = 1.0 / (float)iVar26;
                lVar52 = (ulong)(iVar26 - 1) - 1;
                auVar84._8_4_ = (int)lVar52;
                auVar84._0_8_ = lVar52;
                auVar84._12_4_ = (int)((ulong)lVar52 >> 0x20);
                uVar58 = 0;
                auVar84 = auVar84 ^ _DAT_004cb3e0;
                auVar90 = _DAT_004cb3c0;
                auVar101 = _DAT_004cb3d0;
                do {
                  auVar108 = auVar101 ^ _DAT_004cb3e0;
                  iVar28 = auVar84._4_4_;
                  if ((bool)(~(auVar108._4_4_ == iVar28 && auVar84._0_4_ < auVar108._0_4_ ||
                              iVar28 < auVar108._4_4_) & 1)) {
                    *(float *)(&txfm_param.tx_type + uVar58) = fVar77;
                  }
                  if ((auVar108._12_4_ != auVar84._12_4_ || auVar108._8_4_ <= auVar84._8_4_) &&
                      auVar108._12_4_ <= auVar84._12_4_) {
                    *(float *)((long)&txfm_param.lossless + uVar58) = fVar77;
                  }
                  iVar76 = SUB164(auVar90 ^ _DAT_004cb3e0,4);
                  if (iVar76 <= iVar28 &&
                      (iVar76 != iVar28 || SUB164(auVar90 ^ _DAT_004cb3e0,0) <= auVar84._0_4_)) {
                    *(float *)((long)&txfm_param.bd + uVar58) = fVar77;
                    *(float *)((long)&txfm_param.is_hbd + uVar58) = fVar77;
                  }
                  lVar52 = auVar101._8_8_;
                  auVar101._0_8_ = auVar101._0_8_ + 4;
                  auVar101._8_8_ = lVar52 + 4;
                  lVar52 = auVar90._8_8_;
                  auVar90._0_8_ = auVar90._0_8_ + 4;
                  auVar90._8_8_ = lVar52 + 4;
                  uVar58 = uVar58 + 0x10;
                } while (((ulong)(iVar26 - 1) * 4 + 0xc & 0xfffffffffffffff0) != uVar58);
              }
            }
            else {
              local_6d0 = (float)uVar58;
              local_5f0 = (int16_t *)(long)(iVar28 + -1);
              uVar62 = 0;
              memset(ctxl,0,(long)local_5f0 * 4);
              uVar42 = iVar26 - 1;
              memset(&txfm_param,0,(long)(int)uVar42 * 4);
              uVar58 = (ulong)local_5f0 & 0xffffffff;
              iVar27 = (int)local_6d8;
              if (1 < iVar26) {
                uVar62 = 0;
                do {
                  if (iVar28 < 2) {
                    uVar64 = 0;
                  }
                  else {
                    fVar77 = *(float *)(&txfm_param.tx_type + uVar62 * 4);
                    uVar64 = 0;
                    do {
                      fVar77 = fVar77 + (float)(uint)(&__s->log_scale)[uVar64];
                      *(float *)(ctxl + uVar64 * 4) =
                           (float)(uint)(&__s->log_scale)[uVar64] + *(float *)(ctxl + uVar64 * 4);
                      uVar64 = uVar64 + 1;
                    } while (uVar58 != uVar64);
                    *(float *)(&txfm_param.tx_type + uVar62 * 4) = fVar77;
                  }
                  *(float *)(&txfm_param.tx_type + uVar62 * 4) =
                       (float)(uint)(&quant_param.log_scale)[uVar62 * (long)iVar28 + uVar64] +
                       *(float *)(&txfm_param.tx_type + uVar62 * 4);
                  uVar62 = uVar62 + 1;
                  __s = (QUANT_PARAM *)(&__s->log_scale + iVar28);
                } while (uVar62 != uVar42);
              }
              if (1 < iVar28) {
                uVar64 = 0;
                do {
                  *(float *)(ctxl + uVar64 * 4) =
                       (float)(uint)(&quant_param.log_scale)[(long)((int)uVar62 * iVar28) + uVar64]
                       + *(float *)(ctxl + uVar64 * 4);
                  uVar64 = uVar64 + 1;
                } while (uVar58 != uVar64);
                uVar62 = 0;
                do {
                  *(float *)(ctxl + uVar62 * 4) = *(float *)(ctxl + uVar62 * 4) * (1.0 / local_6d0);
                  uVar62 = uVar62 + 1;
                } while (uVar58 != uVar62);
              }
              if (1 < iVar26) {
                uVar58 = 0;
                do {
                  *(float *)(&txfm_param.tx_type + uVar58 * 4) =
                       *(float *)(&txfm_param.tx_type + uVar58 * 4) * (1.0 / local_6d0);
                  uVar58 = uVar58 + 1;
                } while (uVar42 != uVar58);
              }
            }
            (*av1_get_horver_correlation_full)
                      (piVar2,(uint)bVar15,uVar65,iVar27,
                       (float *)(ctxl + (long)(int)local_6cc * 4 + -4),
                       (float *)((long)&dist_1 +
                                (long)(int)(uVar36 >> (~(byte)(0x14163L >> (bVar4 & 0x3f)) & 1)) * 4
                                + 4));
            (*av1_nn_predict)((float *)ctxl,pNVar12,1,(float *)idx_v);
            (*av1_nn_predict)((float *)&txfm_param,pNVar13,1,(float *)idx_h);
            quant_param.log_scale = (int)((float)idx_v[0] * (float)idx_h[0]);
            quant_param.xform_quant_idx = (int)((float)idx_v[0] * (float)idx_h[2]);
            quant_param._4_4_ = (float)idx_v[1] * (float)idx_h[0];
            quant_param._36_4_ = (float)idx_v[1] * (float)idx_h[2];
            quant_param.qmatrix._0_4_ = (float)idx_v[2] * (float)idx_h[0];
            quant_param.qmatrix._4_4_ = (float)idx_v[3] * (float)idx_h[0];
            quant_param.iqmatrix._4_4_ = (float)idx_v[1] * (float)idx_h[1];
            quant_param.iqmatrix._0_4_ = (float)idx_v[0] * (float)idx_h[1];
            quant_param.use_quant_b_adapt = (float)idx_v[2] * (float)idx_h[1];
            quant_param.use_optimize_b = (int)((float)idx_v[3] * (float)idx_h[1]);
            uVar114 = quant_param._24_8_;
            (*av1_nn_fast_softmax_16)((float *)&quant_param,(float *)&quant_param);
            uVar36 = (uint)local_618;
            if ((char)local_6e8 == '\x04') {
              fVar77 = av1_tx_type_nn_bias_16x4_ver_layer1[((ulong)local_5f8 & 0xff) * 2 + 3];
            }
            else {
              fVar77 = 0.0;
              if ((int)local_5d8 == 5) {
                fVar77 = av1_tx_type_nn_bias_16x4_ver_layer1[((ulong)local_5f8 & 0xff) * 2 + 2];
              }
            }
            fVar77 = prune_2D_adaptive_thresholds[local_730][(int)fVar77];
            local_6f8 = 0xff000000ff;
            uStack_6f0 = 0xff000000ff;
            local_708 = 0xff000000ff;
            uStack_700 = 0xff000000ff;
            local_718 = 0xff000000ff;
            uStack_710 = 0xff000000ff;
            dist = 0xff000000ff;
            uStack_720 = 0xff000000ff;
            uStack_6b0 = 0xbf800000bf800000;
            txfm_param_2.tx_set_type = '\0';
            txfm_param_2._17_3_ = 0xbf8000;
            txfm_param_2.eob = -0x40800000;
            txfm_param_2.bd = -0x40800000;
            txfm_param_2.is_hbd = -0x40800000;
            txfm_param_2.tx_type = '\0';
            txfm_param_2.tx_size = '\0';
            txfm_param_2._2_2_ = 0xbf80;
            txfm_param_2.lossless = -0x40800000;
            fVar123 = 0.0;
            uVar62 = 0;
            puVar47 = &prune_tx_2D_tx_type_table_2D;
            uVar42 = 0;
            fVar100 = 0.0;
            uVar58 = 0;
            uVar65 = 0;
            do {
              uVar74 = *puVar47;
              if ((uVar36 >> (uVar74 & 0x1f) & 1) != 0) {
                fVar44 = (float)(&quant_param.log_scale)[uVar62];
                if (fVar100 < fVar44) {
                  uVar58 = uVar62 & 0xffffffff;
                  fVar100 = fVar44;
                }
                if (fVar77 <= fVar44) {
                  uVar65 = uVar65 | 1 << ((byte)uVar74 & 0x1f);
                  fVar123 = fVar123 + fVar44;
                  *(float *)(&txfm_param_2.tx_type + (long)(int)uVar42 * 4) = fVar44;
                  *(uint *)((long)&dist + (long)(int)uVar42 * 4) = uVar74;
                  uVar42 = uVar42 + 1;
                }
              }
              uVar62 = uVar62 + 1;
              puVar47 = puVar47 + 1;
            } while (uVar62 != 0x10);
            piVar38 = (int64_t *)&prune_tx_2D_tx_type_table_2D;
            if (((uVar65 & 0xffff) >> ((&prune_tx_2D_tx_type_table_2D)[(int)uVar58] & 0x1f) & 1) ==
                0) {
              uVar65 = uVar65 | 1 << ((byte)(&prune_tx_2D_tx_type_table_2D)[(int)uVar58] & 0x1f);
            }
            else {
              uVar36 = -(uint)((float)txfm_param_2._0_4_ < (float)txfm_param_2.lossless);
              uVar74 = -(uint)((float)txfm_param_2.bd < (float)txfm_param_2.is_hbd);
              fVar77 = dist._4_4_;
              if ((uVar36 & 1) != 0) {
                fVar77 = (float)dist;
                dist._0_4_ = dist._4_4_;
              }
              bVar71 = (uVar74 & 1) != 0;
              fVar100 = (float)uStack_720;
              if (bVar71) {
                fVar100 = uStack_720._4_4_;
              }
              if (bVar71) {
                uStack_720._4_4_ = (float)uStack_720;
              }
              uVar73 = -(uint)((float)txfm_param_2._16_4_ < (float)txfm_param_2.eob);
              uVar75 = -(uint)((float)uStack_6b0 < uStack_6b0._4_4_);
              fVar44 = local_718._4_4_;
              if ((uVar73 & 1) != 0) {
                fVar44 = (float)local_718;
                local_718._0_4_ = local_718._4_4_;
              }
              fVar57 = uStack_710._4_4_;
              if ((uVar75 & 1) != 0) {
                fVar57 = (float)uStack_710;
                uStack_710._0_4_ = uStack_710._4_4_;
              }
              auVar107._0_4_ = ~uVar36 & txfm_param_2._0_4_;
              auVar107._4_4_ = ~uVar36 & txfm_param_2.lossless;
              auVar107._8_4_ = ~uVar74 & txfm_param_2.bd;
              auVar107._12_4_ = ~uVar74 & txfm_param_2.is_hbd;
              auVar102._0_4_ = txfm_param_2.lossless & uVar36;
              auVar102._4_4_ = txfm_param_2._0_4_ & uVar36;
              auVar102._8_4_ = txfm_param_2.is_hbd & uVar74;
              auVar102._12_4_ = txfm_param_2.bd & uVar74;
              auVar103 = auVar102 | auVar107;
              auVar79._0_4_ = ~uVar73 & txfm_param_2._16_4_;
              auVar79._4_4_ = ~uVar73 & txfm_param_2.eob;
              auVar79._8_4_ = ~uVar75 & (uint)(float)uStack_6b0;
              auVar79._12_4_ = ~uVar75 & (uint)uStack_6b0._4_4_;
              auVar91._0_4_ = txfm_param_2.eob & uVar73;
              auVar91._4_4_ = txfm_param_2._16_4_ & uVar73;
              auVar91._8_4_ = (uint)uStack_6b0._4_4_ & uVar75;
              auVar91._12_4_ = (uint)(float)uStack_6b0 & uVar75;
              auVar92 = auVar91 | auVar79;
              fVar105 = auVar103._4_4_;
              auVar16._4_8_ = uVar114;
              auVar16._0_4_ = fVar105;
              auVar113._0_8_ = auVar16._0_8_ << 0x20;
              auVar104._8_4_ = auVar103._8_4_;
              auVar113._8_4_ = auVar104._8_4_;
              auVar104._12_4_ = auVar103._12_4_;
              auVar113._12_4_ = auVar104._12_4_;
              fVar98 = auVar103._0_4_;
              fVar95 = auVar92._4_4_;
              auVar17._4_8_ = auVar79._8_8_;
              auVar17._0_4_ = fVar95;
              auVar80._0_8_ = auVar17._0_8_ << 0x20;
              auVar93._8_4_ = auVar92._8_4_;
              auVar80._8_4_ = auVar93._8_4_;
              auVar93._12_4_ = auVar92._12_4_;
              auVar80._12_4_ = auVar93._12_4_;
              fVar85 = auVar92._0_4_;
              if ((int)uVar42 < 9) {
                fVar54 = (float)(~-(uint)(fVar98 < auVar104._8_4_) & (uint)fVar98 |
                                -(uint)(fVar98 < auVar104._8_4_) & (uint)auVar104._8_4_);
                fVar51 = (float)dist;
                if (auVar104._8_4_ <= fVar98) {
                  auVar104._0_8_ = auVar113._8_8_;
                  fVar51 = fVar100;
                  auVar103 = auVar104;
                  fVar100 = (float)dist;
                }
                fVar49 = auVar103._0_4_;
                bVar71 = fVar105 < auVar104._12_4_;
                uVar36 = -(uint)bVar71 & (uint)auVar104._12_4_;
                fVar98 = uStack_720._4_4_;
                if (fVar105 < auVar104._12_4_) {
                  fVar98 = fVar77;
                  auVar104._12_4_ = fVar105;
                  fVar77 = uStack_720._4_4_;
                }
                fVar35 = (float)(~-(uint)bVar71 & (uint)fVar105 | uVar36);
                fVar99 = (float)(~-(uint)(fVar85 < auVar93._8_4_) & (uint)fVar85 |
                                -(uint)(fVar85 < auVar93._8_4_) & (uint)auVar93._8_4_);
                fVar105 = (float)local_718;
                auVar108 = auVar92;
                if (auVar93._8_4_ <= fVar85) {
                  auVar93._0_8_ = auVar80._8_8_;
                  fVar105 = (float)uStack_710;
                  auVar108 = auVar93;
                  uStack_710._0_4_ = (float)local_718;
                }
                txfm_param_2._16_8_ = auVar92._4_8_ << 0x20;
                fVar86 = auVar108._0_4_;
                uStack_6b0._0_4_ = fVar86;
                uStack_6b0._4_4_ = auVar93._12_4_;
                fVar61 = (float)(~-(uint)(fVar95 < auVar93._12_4_) & (uint)fVar95 |
                                -(uint)(fVar95 < auVar93._12_4_) & (uint)auVar93._12_4_);
                fVar85 = fVar57;
                if (fVar95 < auVar93._12_4_) {
                  fVar85 = fVar44;
                  auVar93._12_4_ = fVar95;
                  fVar44 = fVar57;
                }
                auVar19._4_8_ = uStack_6b0;
                auVar19._0_4_ = fVar61;
                stack0xfffffffffffff948 = auVar19 << 0x20;
                uStack_6b0._4_4_ = auVar93._12_4_;
                fVar95 = (float)(-(uint)(fVar35 < fVar49) & (uint)fVar49 |
                                ~-(uint)(fVar35 < fVar49) & (uint)fVar35);
                fVar57 = fVar51;
                if (fVar35 < fVar49) {
                  fVar57 = fVar77;
                  fVar77 = fVar51;
                  fVar49 = fVar35;
                }
                fVar51 = (float)(-(uint)(fVar61 < fVar86) & (uint)fVar86 |
                                ~-(uint)(fVar61 < fVar86) & (uint)fVar61);
                fVar35 = fVar105;
                if (fVar61 < fVar86) {
                  fVar35 = fVar44;
                  fVar44 = fVar105;
                  fVar86 = fVar61;
                }
                auVar20._4_8_ = uStack_6b0;
                auVar20._0_4_ = fVar51;
                txfm_param_2._16_8_ = auVar20._0_8_ << 0x20;
                uStack_6b0._0_4_ = fVar86;
                uVar36 = ~-(uint)(fVar54 < fVar99) & (uint)fVar54 |
                         -(uint)(fVar54 < fVar99) & (uint)fVar99;
                fVar105 = (float)uStack_710;
                if (fVar54 < fVar99) {
                  fVar105 = fVar100;
                  fVar99 = fVar54;
                  fVar100 = (float)uStack_710;
                }
                stack0xfffffffffffff948 = stack0xfffffffffffff94c << 0x20;
                fVar61 = (float)(~-(uint)(auVar104._12_4_ < auVar93._12_4_) & (uint)auVar104._12_4_
                                | -(uint)(auVar104._12_4_ < auVar93._12_4_) & (uint)auVar93._12_4_);
                fVar54 = fVar85;
                if (auVar104._12_4_ < auVar93._12_4_) {
                  fVar54 = fVar98;
                  auVar93._12_4_ = auVar104._12_4_;
                  fVar98 = fVar85;
                }
                uStack_6b0._4_4_ = auVar93._12_4_;
                fVar85 = (float)(~-(uint)(fVar95 < fVar51) & (uint)fVar95 |
                                -(uint)(fVar95 < fVar51) & (uint)fVar51);
                auVar104._12_4_ = fVar44;
                if (fVar95 < fVar51) {
                  auVar104._12_4_ = fVar77;
                  fVar51 = fVar95;
                  fVar77 = fVar44;
                }
                auVar21._4_8_ = uStack_6b0;
                auVar21._0_4_ = fVar51;
                txfm_param_2._16_8_ = auVar21._0_8_ << 0x20;
                fVar95 = (float)(~-(uint)(fVar49 < fVar86) & (uint)fVar49 |
                                -(uint)(fVar49 < fVar86) & (uint)fVar86);
                fVar44 = fVar35;
                if (fVar49 < fVar86) {
                  fVar44 = fVar57;
                  fVar57 = fVar35;
                  fVar86 = fVar49;
                }
                uStack_6b0._0_4_ = fVar86;
                bVar71 = fVar85 < fVar99;
                uVar74 = -(uint)bVar71 & (uint)fVar99;
                fVar49 = fVar105;
                if (fVar85 < fVar99) {
                  fVar49 = fVar77;
                  fVar99 = fVar85;
                  fVar77 = fVar105;
                }
                txfm_param_2.lossless = uVar74 | ~-(uint)bVar71 & (uint)fVar85;
                txfm_param_2.tx_type = (char)uVar36;
                txfm_param_2.tx_size = (char)(uVar36 >> 8);
                txfm_param_2._2_2_ = (short)(uVar36 >> 0x10);
                txfm_param_2._16_8_ = txfm_param_2._20_8_ << 0x20;
                dist = CONCAT44(fVar77,fVar100);
                fVar100 = (float)(~-(uint)(fVar61 < fVar86) & (uint)fVar61 |
                                 -(uint)(fVar61 < fVar86) & (uint)fVar86);
                fVar77 = fVar44;
                if (fVar61 < fVar86) {
                  fVar77 = fVar98;
                  fVar98 = fVar44;
                  fVar86 = fVar61;
                }
                uStack_6b0._0_4_ = fVar86;
                uStack_710 = CONCAT44(fVar54,fVar77);
                bVar71 = fVar95 < fVar99;
                uVar36 = -(uint)bVar71 & (uint)fVar99;
                fVar77 = fVar49;
                if (fVar95 < fVar99) {
                  fVar77 = fVar57;
                  fVar99 = fVar95;
                  fVar57 = fVar49;
                }
                txfm_param_2.bd = ~-(uint)bVar71 & (uint)fVar95 | uVar36;
                auVar93._12_4_ =
                     (float)(-(uint)(fVar100 < fVar51) & (uint)fVar51 |
                            ~-(uint)(fVar100 < fVar51) & (uint)fVar100);
                fVar44 = auVar104._12_4_;
                if (fVar100 < fVar51) {
                  fVar44 = fVar98;
                  fVar51 = fVar100;
                  fVar98 = auVar104._12_4_;
                }
                txfm_param_2.eob = (int)fVar51;
                bVar71 = auVar93._12_4_ < fVar99;
                uVar36 = -(uint)bVar71 & (uint)fVar99;
                fVar100 = fVar77;
                if (auVar93._12_4_ < fVar99) {
                  fVar100 = fVar98;
                  fVar99 = auVar93._12_4_;
                  fVar98 = fVar77;
                }
                txfm_param_2.is_hbd = ~-(uint)bVar71 & (uint)auVar93._12_4_ | uVar36;
                txfm_param_2._16_4_ = fVar99;
                uStack_720 = CONCAT44(fVar98,fVar57);
                local_718 = CONCAT44(fVar44,fVar100);
              }
              else {
                auVar120._8_4_ = 0xbf800000;
                auVar120._0_8_ = 0xbf800000bf800000;
                auVar120._12_4_ = 0xbf800000;
                auVar121 = auVar120 | ZEXT816(0);
                fVar54 = (float)(~-(uint)(fVar98 < auVar104._8_4_) & (uint)fVar98 |
                                -(uint)(fVar98 < auVar104._8_4_) & (uint)auVar104._8_4_);
                fVar51 = (float)dist;
                if (auVar104._8_4_ <= fVar98) {
                  auVar103._8_4_ = auVar104._8_4_;
                  auVar103._0_8_ = auVar113._8_8_;
                  auVar103._12_4_ = auVar104._12_4_;
                  fVar51 = fVar100;
                  fVar100 = (float)dist;
                }
                fVar99 = auVar103._0_4_;
                fVar35 = (float)(~-(uint)(fVar105 < auVar104._12_4_) & (uint)fVar105 |
                                -(uint)(fVar105 < auVar104._12_4_) & (uint)auVar104._12_4_);
                fVar98 = uStack_720._4_4_;
                fVar49 = auVar104._12_4_;
                if (fVar105 < auVar104._12_4_) {
                  fVar98 = fVar77;
                  fVar49 = fVar105;
                  fVar77 = uStack_720._4_4_;
                }
                fVar61 = (float)(~-(uint)(fVar85 < auVar93._8_4_) & (uint)fVar85 |
                                -(uint)(fVar85 < auVar93._8_4_) & (uint)auVar93._8_4_);
                uVar36 = ~(uint)auVar93._12_4_ & (uint)fVar95 | (uint)auVar93._12_4_;
                fVar86 = (float)local_718;
                if (auVar93._8_4_ <= fVar85) {
                  auVar92._8_4_ = auVar93._8_4_;
                  auVar92._0_8_ = auVar80._8_8_;
                  auVar92._12_4_ = auVar93._12_4_;
                  fVar86 = (float)uStack_710;
                  uStack_710._0_4_ = (float)local_718;
                }
                fVar87 = auVar92._0_4_;
                fVar116 = (float)(~-(uint)(fVar95 < auVar93._12_4_) & (uint)fVar95 |
                                 -(uint)(fVar95 < auVar93._12_4_) & (uint)auVar93._12_4_);
                fVar85 = fVar57;
                fVar110 = auVar93._12_4_;
                if (fVar95 < auVar93._12_4_) {
                  fVar85 = fVar44;
                  fVar110 = fVar95;
                  fVar44 = fVar57;
                }
                fVar95 = auVar121._0_4_;
                fVar122 = auVar121._4_4_;
                fStack_5d0 = auVar121._8_4_;
                fStack_5cc = auVar121._12_4_;
                fVar57 = (float)(~-(uint)(fVar95 < fStack_5d0) & (uint)fVar95 |
                                -(uint)(fVar95 < fStack_5d0) & (uint)fStack_5d0);
                uVar74 = ~(uint)fStack_5cc & (uint)fVar122 | (uint)fStack_5cc;
                if (fStack_5d0 <= fVar95) {
                  auVar121._8_4_ = fStack_5d0;
                  auVar121._0_8_ = auVar121._8_8_;
                  auVar121._12_4_ = fStack_5cc;
                }
                fVar115 = auVar121._0_4_;
                fVar50 = (float)uStack_6f0;
                if (fStack_5d0 > fVar95) {
                  fVar50 = (float)local_6f8;
                  local_6f8._0_4_ = (float)uStack_6f0;
                }
                fVar45 = (float)(~-(uint)(fVar122 < fStack_5cc) & (uint)fVar122 |
                                -(uint)(fVar122 < fStack_5cc) & (uint)fStack_5cc);
                fVar68 = uStack_6f0._4_4_;
                fVar95 = fStack_5cc;
                if (fVar122 < fStack_5cc) {
                  fVar68 = local_6f8._4_4_;
                  local_6f8._4_4_ = uStack_6f0._4_4_;
                  fVar95 = fVar122;
                }
                fVar118 = (float)(-(uint)(fVar35 < fVar99) & (uint)fVar99 |
                                 ~-(uint)(fVar35 < fVar99) & (uint)fVar35);
                fVar122 = fVar51;
                if (fVar35 < fVar99) {
                  fVar122 = fVar77;
                  fVar77 = fVar51;
                  fVar99 = fVar35;
                }
                fVar51 = (float)(-(uint)(fVar116 < fVar87) & (uint)fVar87 |
                                ~-(uint)(fVar116 < fVar87) & (uint)fVar116);
                fVar35 = fVar86;
                if (fVar116 < fVar87) {
                  fVar35 = fVar44;
                  fVar44 = fVar86;
                  fVar87 = fVar116;
                }
                fVar116 = (float)(~-(uint)(fVar54 < fVar61) & (uint)fVar54 |
                                 -(uint)(fVar54 < fVar61) & (uint)fVar61);
                fVar86 = (float)uStack_710;
                if (fVar54 < fVar61) {
                  fVar86 = fVar100;
                  fVar100 = (float)uStack_710;
                  fVar61 = fVar54;
                }
                local_5f0 = (int16_t *)CONCAT44(local_5f0._4_4_,fVar100);
                fVar60 = (float)(~-(uint)(fVar49 < fVar110) & (uint)fVar49 |
                                -(uint)(fVar49 < fVar110) & (uint)fVar110);
                fVar54 = fVar85;
                if (fVar49 < fVar110) {
                  fVar54 = fVar98;
                  fVar98 = fVar85;
                  fVar110 = fVar49;
                }
                fVar85 = (float)(-(uint)(fVar45 < fVar115) & (uint)fVar115 |
                                ~-(uint)(fVar45 < fVar115) & (uint)fVar45);
                fVar49 = fVar50;
                if (fVar45 < fVar115) {
                  fVar49 = local_6f8._4_4_;
                  local_6f8._4_4_ = fVar50;
                  fVar115 = fVar45;
                }
                fVar50 = (float)(~-(uint)(-1.0 < fVar57) & 0xbf800000 |
                                -(uint)(-1.0 < fVar57) & (uint)fVar57);
                uVar73 = ~uVar74 & 0xbf800000 | uVar74;
                uStack_610 = ~(uint)fStack_5d0 & 0xbf800000 | (uint)fStack_5d0;
                uStack_60c = ~(uint)fStack_5cc & 0xbf800000 | (uint)fStack_5cc;
                fVar45 = (float)local_6f8;
                if (-1.0 < fVar57) {
                  fVar45 = (float)local_708;
                  local_708._0_4_ = (float)local_6f8;
                  fStack_5cc = -1.0;
                  fStack_5d0 = -1.0;
                  uVar74 = 0xbf800000;
                  fVar57 = -1.0;
                }
                local_5d8 = CONCAT44(uVar74,fVar57);
                fVar125 = (float)(~-(uint)(-1.0 < fVar95) & 0xbf800000 |
                                 -(uint)(-1.0 < fVar95) & (uint)fVar95);
                local_6cc = fVar68;
                if (-1.0 < fVar95) {
                  local_6cc = uStack_700._4_4_;
                  uStack_700._4_4_ = fVar68;
                  fVar95 = -1.0;
                }
                local_6d0 = uStack_700._4_4_;
                fVar119 = (float)(~-(uint)(fVar118 < fVar51) & (uint)fVar118 |
                                 -(uint)(fVar118 < fVar51) & (uint)fVar51);
                fVar68 = fVar44;
                if (fVar118 < fVar51) {
                  fVar68 = fVar77;
                  fVar51 = fVar118;
                  fVar77 = fVar44;
                }
                fVar118 = (float)(~-(uint)(fVar99 < fVar87) & (uint)fVar99 |
                                 -(uint)(fVar99 < fVar87) & (uint)fVar87);
                fVar44 = fVar35;
                if (fVar99 < fVar87) {
                  fVar44 = fVar122;
                  fVar122 = fVar35;
                  fVar87 = fVar99;
                }
                fVar35 = (float)(~-(uint)(-1.0 < fVar85) & 0xbf800000 |
                                -(uint)(-1.0 < fVar85) & (uint)fVar85);
                fVar99 = local_6f8._4_4_;
                if (-1.0 < fVar85) {
                  fVar99 = local_708._4_4_;
                  local_708._4_4_ = local_6f8._4_4_;
                  fVar85 = -1.0;
                }
                fVar124 = (float)(~-(uint)(-1.0 < fVar115) & 0xbf800000 |
                                 -(uint)(-1.0 < fVar115) & (uint)fVar115);
                fVar117 = fVar49;
                if (-1.0 < fVar115) {
                  fVar117 = (float)uStack_700;
                  uStack_700._0_4_ = fVar49;
                  fVar115 = -1.0;
                }
                uVar74 = ~-(uint)(fVar116 < fVar50) & (uint)fVar116 |
                         -(uint)(fVar116 < fVar50) & (uint)fVar50;
                fVar49 = (float)local_708;
                if (fVar116 < fVar50) {
                  fVar49 = fVar100;
                  fVar100 = (float)local_708;
                  uStack_60c = ~(uint)auVar93._12_4_ & (uint)auVar104._12_4_ | (uint)auVar93._12_4_;
                  uStack_610 = ~(uint)auVar93._8_4_ & (uint)auVar104._8_4_ | (uint)auVar93._8_4_;
                  uVar73 = ~uVar36 & (~(uint)auVar104._12_4_ & (uint)fVar105 | (uint)auVar104._12_4_
                                     ) | uVar36;
                  fVar50 = fVar116;
                }
                auVar93._12_4_ =
                     (float)(~-(uint)(fVar110 < fVar95) & (uint)fVar110 |
                            -(uint)(fVar110 < fVar95) & (uint)fVar95);
                auVar104._12_4_ = local_6cc;
                if (fVar110 < fVar95) {
                  auVar104._12_4_ = fVar54;
                  fVar54 = local_6cc;
                }
                local_6e8 = (CommonQuantParams *)CONCAT44(local_6e8._4_4_,fVar54);
                fVar105 = (float)(-(uint)(fVar119 < fVar61) & (uint)fVar61 |
                                 ~-(uint)(fVar119 < fVar61) & (uint)fVar119);
                fVar95 = fVar86;
                if (fVar119 < fVar61) {
                  fVar95 = fVar77;
                  fVar61 = fVar119;
                  fVar77 = fVar86;
                }
                fVar110 = (float)(~-(uint)(fVar60 < fVar87) & (uint)fVar60 |
                                 -(uint)(fVar60 < fVar87) & (uint)fVar87);
                fVar86 = fVar44;
                if (fVar60 < fVar87) {
                  fVar86 = fVar98;
                  fVar98 = fVar44;
                  fVar87 = fVar60;
                }
                fVar116 = (float)(-(uint)(fVar35 < fVar57) & (uint)fVar57 |
                                 ~-(uint)(fVar35 < fVar57) & (uint)fVar35);
                fVar44 = fVar35;
                if (fVar57 <= fVar35) {
                  fVar44 = fVar57;
                }
                local_618 = (tran_low_t *)CONCAT44(uVar73,fVar50);
                fVar60 = fVar45;
                if (fVar57 > fVar35) {
                  fVar60 = local_708._4_4_;
                  local_708._4_4_ = fVar45;
                }
                fVar35 = (float)(~-(uint)(fVar125 < fVar115) & (uint)fVar125 |
                                -(uint)(fVar125 < fVar115) & (uint)fVar115);
                fVar57 = fVar117;
                if (fVar125 < fVar115) {
                  fVar57 = uStack_700._4_4_;
                  uStack_700._4_4_ = fVar117;
                  fVar115 = fVar125;
                }
                fVar125 = (float)(~-(uint)(fVar118 < fVar61) & (uint)fVar118 |
                                 -(uint)(fVar118 < fVar61) & (uint)fVar61);
                fVar45 = fVar95;
                if (fVar118 < fVar61) {
                  fVar45 = fVar122;
                  fVar122 = fVar95;
                  fVar61 = fVar118;
                }
                fVar118 = (float)(-(uint)(fVar110 < fVar51) & (uint)fVar51 |
                                 ~-(uint)(fVar110 < fVar51) & (uint)fVar110);
                fVar95 = fVar68;
                if (fVar110 < fVar51) {
                  fVar95 = fVar98;
                  fVar98 = fVar68;
                  fVar51 = fVar110;
                }
                fVar110 = (float)(~-(uint)(fVar124 < fVar44) & (uint)fVar124 |
                                 -(uint)(fVar124 < fVar44) & (uint)fVar44);
                fVar68 = fVar60;
                if (fVar124 < fVar44) {
                  fVar68 = (float)uStack_700;
                  fVar44 = fVar124;
                  uStack_700._0_4_ = fVar60;
                }
                fVar119 = (float)(-(uint)(fVar35 < fVar85) & (uint)fVar85 |
                                 ~-(uint)(fVar35 < fVar85) & (uint)fVar35);
                fVar60 = fVar99;
                if (fVar35 < fVar85) {
                  fVar60 = uStack_700._4_4_;
                  fVar85 = fVar35;
                  uStack_700._4_4_ = fVar99;
                }
                fVar35 = (float)(~-(uint)(fVar105 < fVar116) & (uint)fVar105 |
                                -(uint)(fVar105 < fVar116) & (uint)fVar116);
                fVar99 = local_708._4_4_;
                if (fVar105 < fVar116) {
                  fVar99 = fVar77;
                  fVar116 = fVar105;
                  fVar77 = local_708._4_4_;
                }
                fVar117 = (float)(~-(uint)(fVar87 < fVar115) & (uint)fVar87 |
                                 -(uint)(fVar87 < fVar115) & (uint)fVar115);
                fVar105 = fVar57;
                if (fVar87 < fVar115) {
                  fVar105 = fVar86;
                  fVar86 = fVar57;
                  fVar115 = fVar87;
                }
                fVar87 = (float)(~-(uint)(fVar118 < fVar61) & (uint)fVar118 |
                                -(uint)(fVar118 < fVar61) & (uint)fVar61);
                fVar57 = fVar45;
                if (fVar118 < fVar61) {
                  fVar57 = fVar98;
                  fVar98 = fVar45;
                  fVar61 = fVar118;
                }
                local_6d8 = CONCAT44(local_6d8._4_4_,fVar57);
                fVar118 = (float)(~-(uint)(fVar119 < fVar44) & (uint)fVar119 |
                                 -(uint)(fVar119 < fVar44) & (uint)fVar44);
                fVar45 = fVar68;
                if (fVar119 < fVar44) {
                  fVar45 = uStack_700._4_4_;
                  fVar44 = fVar119;
                  uStack_700._4_4_ = fVar68;
                }
                bVar71 = fVar35 < fVar50;
                uVar36 = -(uint)bVar71 & (uint)fVar50;
                fVar68 = fVar49;
                if (fVar35 < fVar50) {
                  fVar68 = fVar77;
                  fVar50 = fVar35;
                  fVar77 = fVar49;
                }
                txfm_param_2.lossless = uVar36 | ~-(uint)bVar71 & (uint)fVar35;
                txfm_param_2.tx_type = (char)uVar74;
                txfm_param_2.tx_size = (char)(uVar74 >> 8);
                txfm_param_2._2_2_ = (short)(uVar74 >> 0x10);
                dist = CONCAT44(fVar77,fVar100);
                fVar100 = (float)(~-(uint)(fVar125 < fVar110) & (uint)fVar125 |
                                 -(uint)(fVar125 < fVar110) & (uint)fVar110);
                fVar77 = (float)uStack_700;
                if (fVar125 < fVar110) {
                  fVar77 = fVar122;
                  fVar110 = fVar125;
                  fVar122 = (float)uStack_700;
                }
                fVar35 = (float)(~-(uint)(fVar51 < fVar85) & (uint)fVar51 |
                                -(uint)(fVar51 < fVar85) & (uint)fVar85);
                fVar49 = fVar60;
                if (fVar51 < fVar85) {
                  fVar49 = fVar95;
                  fVar95 = fVar60;
                  fVar85 = fVar51;
                }
                fVar60 = (float)(~-(uint)(auVar93._12_4_ < fVar115) & (uint)auVar93._12_4_ |
                                -(uint)(auVar93._12_4_ < fVar115) & (uint)fVar115);
                fVar51 = fVar105;
                if (auVar93._12_4_ < fVar115) {
                  fVar51 = fVar54;
                  fVar54 = fVar105;
                }
                uStack_6f0 = CONCAT44(auVar104._12_4_,fVar51);
                auVar93._12_4_ =
                     (float)(~-(uint)(fVar87 < fVar118) & (uint)fVar87 |
                            -(uint)(fVar87 < fVar118) & (uint)fVar118);
                auVar104._12_4_ = uStack_700._4_4_;
                if (fVar87 < fVar118) {
                  auVar104._12_4_ = fVar98;
                  fVar118 = fVar87;
                  fVar98 = uStack_700._4_4_;
                }
                bVar71 = fVar100 < fVar50;
                uVar36 = -(uint)bVar71 & (uint)fVar50;
                fVar105 = fVar68;
                if (fVar100 < fVar50) {
                  fVar105 = fVar122;
                  fVar50 = fVar100;
                  fVar122 = fVar68;
                }
                txfm_param_2.bd = ~-(uint)bVar71 & (uint)fVar100 | uVar36;
                fVar51 = (float)(~-(uint)(fVar61 < fVar44) & (uint)fVar61 |
                                -(uint)(fVar61 < fVar44) & (uint)fVar44);
                fVar100 = fVar45;
                if (fVar61 < fVar44) {
                  fVar100 = fVar57;
                  fVar57 = fVar45;
                  fVar44 = fVar61;
                }
                fVar87 = (float)(~-(uint)(fVar60 < fVar85) & (uint)fVar60 |
                                -(uint)(fVar60 < fVar85) & (uint)fVar85);
                fVar61 = fVar49;
                if (fVar60 < fVar85) {
                  fVar61 = fVar54;
                  fVar54 = fVar49;
                }
                fVar49 = (float)(-(uint)(auVar93._12_4_ < fVar110) & (uint)fVar110 |
                                ~-(uint)(auVar93._12_4_ < fVar110) & (uint)auVar93._12_4_);
                fVar85 = fVar77;
                if (auVar93._12_4_ < fVar110) {
                  fVar85 = fVar98;
                  fVar110 = auVar93._12_4_;
                  fVar98 = fVar77;
                }
                auVar93._12_4_ =
                     (float)(~-(uint)(fVar35 < fVar44) & (uint)fVar35 |
                            -(uint)(fVar35 < fVar44) & (uint)fVar44);
                fVar77 = fVar100;
                if (fVar35 < fVar44) {
                  fVar77 = fVar95;
                  fVar44 = fVar35;
                  fVar95 = fVar100;
                }
                fVar35 = (float)(-(uint)(fVar49 < fVar116) & (uint)fVar116 |
                                ~-(uint)(fVar49 < fVar116) & (uint)fVar49);
                fVar100 = fVar99;
                if (fVar49 < fVar116) {
                  fVar100 = fVar98;
                  fVar116 = fVar49;
                  fVar98 = fVar99;
                }
                fVar99 = (float)(~-(uint)(fVar117 < fVar44) & (uint)fVar117 |
                                -(uint)(fVar117 < fVar44) & (uint)fVar44);
                fVar49 = fVar77;
                if (fVar117 < fVar44) {
                  fVar49 = fVar86;
                  fVar44 = fVar117;
                  fVar86 = fVar77;
                }
                bVar71 = fVar35 < fVar50;
                uVar36 = -(uint)bVar71 & (uint)fVar50;
                fVar77 = fVar105;
                if (fVar35 < fVar50) {
                  fVar77 = fVar98;
                  fVar50 = fVar35;
                  fVar98 = fVar105;
                }
                txfm_param_2.is_hbd = uVar36 | ~-(uint)bVar71 & (uint)fVar35;
                uStack_720 = CONCAT44(fVar98,fVar122);
                fVar105 = (float)(~-(uint)(fVar87 < fVar44) & (uint)fVar87 |
                                 -(uint)(fVar87 < fVar44) & (uint)fVar44);
                fVar98 = fVar49;
                if (fVar87 < fVar44) {
                  fVar98 = fVar54;
                  fVar54 = fVar49;
                }
                local_6f8 = CONCAT44(fVar61,fVar98);
                fVar98 = (float)(~-(uint)(auVar93._12_4_ < fVar116) & (uint)auVar93._12_4_ |
                                -(uint)(auVar93._12_4_ < fVar116) & (uint)fVar116);
                fVar44 = fVar100;
                if (auVar93._12_4_ < fVar116) {
                  fVar44 = fVar95;
                  fVar116 = auVar93._12_4_;
                  fVar95 = fVar100;
                }
                auVar93._12_4_ =
                     (float)(-(uint)(fVar99 < fVar110) & (uint)fVar110 |
                            ~-(uint)(fVar99 < fVar110) & (uint)fVar99);
                fVar100 = fVar85;
                if (fVar99 < fVar110) {
                  fVar100 = fVar86;
                  fVar110 = fVar99;
                  fVar86 = fVar85;
                }
                bVar71 = fVar51 < fVar50;
                uVar36 = -(uint)bVar71 & (uint)fVar50;
                fVar85 = fVar77;
                if (fVar51 < fVar50) {
                  fVar85 = fVar57;
                  fVar50 = fVar51;
                  fVar57 = fVar77;
                }
                fVar49 = (float)(-(uint)(fVar105 < fVar118) & (uint)fVar118 |
                                ~-(uint)(fVar105 < fVar118) & (uint)fVar105);
                fVar77 = auVar104._12_4_;
                if (fVar105 < fVar118) {
                  fVar77 = fVar54;
                  fVar54 = auVar104._12_4_;
                }
                bVar70 = fVar98 < fVar50;
                uVar74 = -(uint)bVar70 & (uint)fVar50;
                auVar104._12_4_ = fVar85;
                if (fVar98 < fVar50) {
                  auVar104._12_4_ = fVar95;
                  fVar50 = fVar98;
                  fVar95 = fVar85;
                }
                txfm_param_2.eob = ~-(uint)bVar70 & (uint)fVar98 | uVar74;
                txfm_param_2._16_4_ = ~-(uint)bVar71 & (uint)fVar51 | uVar36;
                local_718 = CONCAT44(fVar95,fVar57);
                fVar85 = (float)(-(uint)(fVar49 < fVar110) & (uint)fVar110 |
                                ~-(uint)(fVar49 < fVar110) & (uint)fVar49);
                fVar57 = fVar100;
                if (fVar49 < fVar110) {
                  fVar57 = fVar54;
                  fVar54 = fVar100;
                }
                uStack_700 = CONCAT44(fVar77,fVar57);
                bVar71 = auVar93._12_4_ < fVar50;
                uVar36 = -(uint)bVar71 & (uint)fVar50;
                fVar77 = auVar104._12_4_;
                if (auVar93._12_4_ < fVar50) {
                  fVar77 = fVar86;
                  fVar50 = auVar93._12_4_;
                  fVar86 = auVar104._12_4_;
                }
                uStack_6b0._0_4_ = (float)(~-(uint)bVar71 & (uint)auVar93._12_4_ | uVar36);
                fVar57 = (float)(-(uint)(fVar85 < fVar116) & (uint)fVar116 |
                                ~-(uint)(fVar85 < fVar116) & (uint)fVar85);
                fVar100 = fVar44;
                if (fVar85 < fVar116) {
                  fVar100 = fVar54;
                  fVar54 = fVar44;
                }
                fVar44 = fVar77;
                if (fVar57 < fVar50) {
                  fVar44 = fVar54;
                  fVar54 = fVar77;
                }
                uStack_6b0._4_4_ =
                     (float)(~-(uint)(fVar57 < fVar50) & (uint)fVar57 |
                            -(uint)(fVar57 < fVar50) & (uint)fVar50);
                uStack_710 = CONCAT44(fVar54,fVar86);
                local_708 = CONCAT44(fVar100,fVar44);
              }
              piVar38 = &dist;
              if (((ulong)local_5f8 & 0xfc) != 0) {
                if ((int)uVar42 < 1) {
                  uVar36 = 0;
                }
                else {
                  fVar100 = 0.0;
                  uVar58 = 0;
                  fVar77 = 0.0;
                  do {
                    uVar62 = uVar58;
                    if (30.0 < fVar100 && (uVar58 & 0xfffffffe) != 0) break;
                    fVar77 = fVar77 + *(float *)(&txfm_param_2.tx_type + uVar58 * 4);
                    fVar100 = (100.0 / fVar123) * fVar77;
                    uVar58 = uVar58 + 1;
                    uVar62 = (ulong)uVar42;
                  } while (uVar42 != uVar58);
                  uVar36 = (uint)uVar62;
                }
                if ((int)uVar36 < (int)uVar42) {
                  lVar52 = 0;
                  do {
                    uVar65 = uVar65 & ~(1 << (*(byte *)((long)&dist + lVar52 * 4 + (ulong)uVar36 * 4
                                                       ) & 0x1f));
                    lVar52 = lVar52 + 1;
                  } while (uVar42 - uVar36 != (int)lVar52);
                }
              }
            }
            local_4c8 = *piVar38;
            iStack_4c0 = piVar38[1];
            local_4b8 = piVar38[2];
            iStack_4b0 = piVar38[3];
            local_4a8 = piVar38[4];
            iStack_4a0 = piVar38[5];
            local_498 = piVar38[6];
            iStack_490 = piVar38[7];
          }
        }
        else {
          iVar26 = (x->txfm_search_params).prune_2d_txfm_mode;
          local_5f8 = (tran_low_t **)(long)prune_factors[iVar26];
          if (7 < uVar36) {
            local_618 = (tran_low_t *)(ulong)(uVar36 * mul_factors[iVar26]);
            idx_v[0] = 0;
            idx_v[1] = 1;
            idx_v[2] = 2;
            idx_v[3] = 3;
            idx_h[0] = 0;
            idx_h[1] = 1;
            idx_h[2] = 2;
            idx_h[3] = 3;
            skip_v[0] = 0;
            skip_v[1] = 0;
            skip_v[2] = 0;
            skip_v[3] = 0;
            skip_h[0] = 0;
            skip_h[1] = 0;
            skip_h[2] = 0;
            skip_h[3] = 0;
            lVar52 = 0;
            av1_setup_xform(cm,x,bVar4,'\0',&txfm_param_2);
            pAVar22 = local_6e0;
            av1_setup_quant((TX_SIZE)local_730,1,1,(local_6e0->oxcf).q_cfg.quant_b_adapt,
                            (QUANT_PARAM *)ctxl);
            txfm_param_2.tx_set_type = 5;
            dist_1 = 0;
            sse = 0;
            local_6e8 = &(pAVar22->common).quant_params;
            do {
              TVar41 = *(TX_TYPE *)((long)&prune_tx_2D_tx_type_table_2D + lVar52);
              txfm_param_2.tx_type = TVar41;
              TVar126 = (TX_SIZE)local_730;
              av1_setup_qmatrix(local_6e8,local_5c8,plane,TVar126,TVar41,(QUANT_PARAM *)ctxl);
              av1_xform_quant(x,plane,block,blk_row,blk_col,plane_bsize,&txfm_param_2,
                              (QUANT_PARAM *)ctxl);
              dist_block_tx_domain
                        (x,plane,block,TVar126,(qm_val_t *)CONCAT44(ctxl._12_4_,ctxl._8_4_),
                         av1_scan_orders[txfm_param_2.tx_size][txfm_param_2.tx_type].scan,&dist_1,
                         &sse);
              iVar26 = av1_cost_coeffs_txb_laplacian
                                 (x,plane,block,TVar126,TVar41,txb_ctx,(int)local_6d8,0);
              lVar48 = dist_1 * 0x80 + ((long)x->rdmult * (long)iVar26 + 0x100 >> 9);
              *(long *)((long)&dist + lVar52 * 2) = lVar48;
              if (ref_best_rd < lVar48 - (lVar48 >> 2)) {
                *(undefined4 *)((long)skip_h + lVar52) = 1;
              }
              lVar52 = lVar52 + 4;
            } while (lVar52 != 0x10);
            lVar52 = 1;
            iVar26 = (uint)local_618;
            do {
              lVar48 = (&dist)[lVar52];
              lVar59 = 0;
LAB_0023d306:
              if ((&dist)[lVar59] <= lVar48) goto code_r0x0023d30d;
              iVar27 = idx_h[lVar52];
              lVar69 = lVar52;
              do {
                (&dist)[lVar69] = (&local_730)[lVar69];
                idx_h[lVar69] = idx_h[lVar69 + -1];
                lVar69 = lVar69 + -1;
              } while (lVar59 < lVar69);
              (&dist)[lVar59] = lVar48;
              idx_h[lVar59] = iVar27;
LAB_0023d35b:
              lVar52 = lVar52 + 1;
            } while (lVar52 != 4);
            lVar52 = 1;
            do {
              if ((double)dist * 1.2 < (double)(&dist)[lVar52]) {
                skip_h[idx_h[lVar52]] = 1;
              }
              lVar52 = lVar52 + 1;
            } while (lVar52 != 4);
            if (skip_h[idx_h[0]] == 0) {
              local_5d8 = (ulong)(uint)((iVar26 + 0x32) / 100);
              txfm_param.tx_type = (undefined1)dist;
              txfm_param.tx_size = dist._1_1_;
              txfm_param._2_2_ = dist._2_2_;
              txfm_param.lossless = (int)dist._4_4_;
              local_618 = &prune_tx_2D_tx_type_table_2D + idx_h[0];
              lVar52 = 1;
              do {
                TVar41 = *(TX_TYPE *)(local_618 + (long)idx_v[lVar52] * 4);
                txfm_param_2.tx_type = TVar41;
                TVar126 = (TX_SIZE)local_730;
                av1_setup_qmatrix(local_6e8,local_5c8,plane,TVar126,TVar41,(QUANT_PARAM *)ctxl);
                av1_xform_quant(x,plane,block,blk_row,blk_col,plane_bsize,&txfm_param_2,
                                (QUANT_PARAM *)ctxl);
                dist_block_tx_domain
                          (x,plane,block,TVar126,(qm_val_t *)CONCAT44(ctxl._12_4_,ctxl._8_4_),
                           av1_scan_orders[txfm_param_2.tx_size][txfm_param_2.tx_type].scan,&dist_1,
                           &sse);
                iVar26 = av1_cost_coeffs_txb_laplacian
                                   (x,plane,block,TVar126,TVar41,txb_ctx,(int)local_6d8,0);
                lVar48 = dist_1 * 0x80 + ((long)x->rdmult * (long)iVar26 + 0x100 >> 9);
                *(long *)(&txfm_param.tx_type + lVar52 * 8) = lVar48;
                if (ref_best_rd < lVar48 - (lVar48 >> 2)) {
                  skip_v[lVar52] = 1;
                }
                lVar52 = lVar52 + 1;
              } while (lVar52 != 4);
              lVar52 = 1;
              do {
                lVar48 = *(long *)(&txfm_param.tx_type + lVar52 * 8);
                lVar59 = 0;
                while (*(long *)(&txfm_param.tx_type + lVar59 * 8) <= lVar48) {
                  lVar59 = lVar59 + 1;
                  if (lVar52 == lVar59) goto LAB_0023d620;
                }
                iVar26 = idx_v[lVar52];
                lVar69 = lVar52;
                do {
                  *(int64_t *)(&txfm_param.tx_type + lVar69 * 8) = (&dist_1)[lVar69];
                  idx_v[lVar69] = idx_h[lVar69 + 3];
                  lVar69 = lVar69 + -1;
                } while (lVar59 < lVar69);
                *(long *)(&txfm_param.tx_type + lVar59 * 8) = lVar48;
                idx_v[lVar59] = iVar26;
LAB_0023d620:
                lVar52 = lVar52 + 1;
              } while (lVar52 != 4);
              lVar52 = 1;
              do {
                if ((double)(long)txfm_param._0_8_ * 1.2 <
                    (double)*(long *)(&txfm_param.tx_type + lVar52 * 8)) {
                  skip_v[idx_v[lVar52]] = 1;
                }
                lVar52 = lVar52 + 1;
              } while (lVar52 != 4);
              lVar52 = 0;
              iVar26 = 0xf;
              uVar36 = 0;
              do {
                iVar27 = *(int *)((long)&DAT_005070e0 + lVar52);
                iVar28 = *(int *)((long)&DAT_00507120 + lVar52);
                uVar42 = (&prune_tx_2D_tx_type_table_2D)
                         [(long)idx_h[iVar28] + (long)idx_v[iVar27] * 4];
                if (((((uint)(int)(short)uVar65 >> (uVar42 & 0x1f) & 1) == 0) ||
                    (skip_h[idx_h[iVar28]] != 0)) || (skip_v[idx_v[iVar27]] != 0)) {
                  *(uint *)((long)&local_4c8 + (long)iVar26 * 4) = uVar42;
                  iVar26 = iVar26 + -1;
                }
                else {
                  *(uint *)((long)&local_4c8 + (long)(int)uVar36 * 4) = uVar42;
                  *(ulong *)(&quant_param.log_scale + (long)(int)uVar36 * 2) =
                       (&dist)[iVar28] + *(long *)(&txfm_param.tx_type + (long)iVar27 * 8) +
                       (ulong)((&dist)[iVar28] + *(long *)(&txfm_param.tx_type + (long)iVar27 * 8)
                              == 0);
                  uVar36 = uVar36 + 1;
                }
                lVar52 = lVar52 + 4;
              } while (lVar52 != 0x40);
              if (1 < (int)uVar36) {
                uVar58 = 1;
                do {
                  lVar52 = *(long *)(&quant_param.log_scale + uVar58 * 2);
                  uVar62 = 0;
LAB_0023d74e:
                  if (*(long *)(&quant_param.log_scale + uVar62 * 2) <= lVar52)
                  goto code_r0x0023d758;
                  uVar7 = *(undefined4 *)((long)&local_4c8 + uVar58 * 4);
                  uVar64 = uVar58;
                  do {
                    *(tran_low_t **)(&quant_param.log_scale + uVar64 * 2) = (&local_440)[uVar64];
                    *(undefined4 *)((long)&local_4c8 + uVar64 * 4) =
                         *(undefined4 *)((long)&local_4d0 + uVar64 * 4 + 4);
                    uVar64 = uVar64 - 1;
                  } while ((long)uVar62 < (long)uVar64);
                  *(long *)(&quant_param.log_scale + uVar62 * 2) = lVar52;
                  *(undefined4 *)((long)&local_4c8 + uVar62 * 4) = uVar7;
LAB_0023d7b1:
                  uVar58 = uVar58 + 1;
                  if (uVar58 == uVar36) break;
                } while( true );
              }
              uVar42 = 1 << ((byte)local_4c8 & 0x1f);
              uVar74 = (uint)local_5d8;
              if ((int)uVar36 < (int)(uint)local_5d8) {
                uVar74 = uVar36;
              }
              if ((int)uVar74 < 2) goto LAB_0023d82e;
              uVar42 = ~uVar42;
              lVar52 = 0;
              do {
                if ((long)local_5f8 <=
                    (((long)(&quant_param.qmatrix)[lVar52] -
                     CONCAT44(quant_param._4_4_,quant_param.log_scale)) * 0x708) /
                    CONCAT44(quant_param._4_4_,quant_param.log_scale)) break;
                uVar42 = uVar42 & ~(1 << (*(byte *)((long)&local_4c8 + lVar52 * 4 + 4) & 0x1f));
                bVar71 = (ulong)uVar74 - 2 != lVar52;
                lVar52 = lVar52 + 1;
              } while (bVar71);
              uVar42 = ~uVar42;
            }
            else {
              uVar42 = 0;
            }
LAB_0023d82e:
            uVar65 = uVar42 & uVar65;
            goto LAB_0023f84f;
          }
          av1_setup_xform(cm,x,bVar4,'\0',&txfm_param);
          pAVar22 = local_6e0;
          av1_setup_quant(bVar4,1,1,(local_6e0->oxcf).q_cfg.quant_b_adapt,(QUANT_PARAM *)ctxl);
          uVar58 = local_730;
          local_5d8 = 0xf;
          uVar42 = 0;
          pCVar63 = (CommonQuantParams *)0x0;
          uVar36 = (uint)local_618;
          do {
            dist = 0;
            auVar18._8_8_ = 0;
            auVar18._0_4_ = txfm_param_2.bd;
            auVar18._4_4_ = txfm_param_2.is_hbd;
            txfm_param_2._0_16_ = auVar18 << 0x40;
            if ((uVar36 >> (uVar42 & 0x1f) & 1) == 0) {
              *(uint *)((long)&local_4c8 + (long)(int)local_5d8 * 4) = uVar42;
              local_5d8 = (ulong)((int)local_5d8 - 1);
            }
            else {
              TVar41 = (TX_TYPE)uVar42;
              txfm_param.tx_type = TVar41;
              TVar126 = (TX_SIZE)uVar58;
              local_6e8 = pCVar63;
              av1_setup_qmatrix(&(pAVar22->common).quant_params,local_5c8,plane,TVar126,TVar41,
                                (QUANT_PARAM *)ctxl);
              av1_xform_quant(x,plane,block,blk_row,blk_col,plane_bsize,&txfm_param,
                              (QUANT_PARAM *)ctxl);
              iVar26 = av1_cost_coeffs_txb_laplacian
                                 (x,plane,block,TVar126,TVar41,txb_ctx,(int)local_6d8,0);
              dist_block_tx_domain
                        (x,plane,block,TVar126,(qm_val_t *)CONCAT44(ctxl._12_4_,ctxl._8_4_),
                         av1_scan_orders[(ulong)txfm_param._0_8_ >> 8 & 0xff]
                         [txfm_param._0_8_ & 0xff].scan,&dist,(int64_t *)&txfm_param_2);
              iVar27 = (int)local_6e8;
              *(uint *)((long)&local_4c8 + (long)iVar27 * 4) = uVar42;
              lVar52 = (long)x->rdmult * (long)iVar26 + 0x100 >> 9;
              *(ulong *)(&quant_param.log_scale + (long)iVar27 * 2) =
                   dist * 0x80 + lVar52 + (ulong)(lVar52 + dist * 0x80 == 0);
              pCVar63 = (CommonQuantParams *)(ulong)(iVar27 + 1);
              uVar36 = (uint)local_618;
            }
            uVar42 = uVar42 + 1;
          } while (uVar42 != 0x10);
          iVar26 = (int)pCVar63;
          if (iVar26 == 0) {
            uVar36 = 0;
          }
          else {
            if (1 < iVar26) {
              pCVar30 = (CommonQuantParams *)0x1;
              do {
                lVar52 = *(long *)(&quant_param.log_scale + (long)pCVar30 * 2);
                pCVar37 = (CommonQuantParams *)0x0;
LAB_0023cde4:
                if (*(long *)(&quant_param.log_scale + (long)pCVar37 * 2) <= lVar52)
                goto code_r0x0023cdee;
                uVar7 = *(undefined4 *)((long)&local_4c8 + (long)pCVar30 * 4);
                pCVar53 = pCVar30;
                do {
                  *(tran_low_t **)(&quant_param.log_scale + (long)pCVar53 * 2) =
                       (&local_440)[(long)pCVar53];
                  *(undefined4 *)((long)&local_4c8 + (long)pCVar53 * 4) =
                       *(undefined4 *)((long)&local_4d0 + (long)pCVar53 * 4 + 4);
                  pCVar53 = (CommonQuantParams *)((long)&pCVar53[-1].qmatrix_level_v + 3);
                } while ((long)pCVar37 < (long)pCVar53);
                *(long *)(&quant_param.log_scale + (long)pCVar37 * 2) = lVar52;
                *(undefined4 *)((long)&local_4c8 + (long)pCVar37 * 4) = uVar7;
LAB_0023ce3d:
                pCVar30 = (CommonQuantParams *)((long)&pCVar30->base_qindex + 1);
                if (pCVar30 == pCVar63) break;
              } while( true );
            }
            uVar36 = 1 << ((byte)local_4c8 & 0x1f);
            if (1 < iVar26) {
              uVar36 = ~uVar36;
              pCVar30 = (CommonQuantParams *)0x1;
              do {
                if ((long)local_5f8 <=
                    ((*(long *)(&quant_param.log_scale + (long)pCVar30 * 2) -
                     CONCAT44(quant_param._4_4_,quant_param.log_scale)) * 1000) /
                    CONCAT44(quant_param._4_4_,quant_param.log_scale)) break;
                uVar36 = uVar36 & ~(1 << (*(byte *)((long)&local_4c8 + (long)pCVar30 * 4) & 0x1f));
                pCVar30 = (CommonQuantParams *)((long)&pCVar30->base_qindex + 1);
              } while (pCVar63 != pCVar30);
              uVar36 = ~uVar36;
            }
          }
          uVar65 = uVar36 & uVar65;
        }
      }
      else {
        uVar65 = uVar65 & 0xc01;
      }
LAB_0023f84f:
      if ((short)uVar65 == 0) {
        bVar34 = (byte)local_5e8;
        uVar65 = 1 << ((byte)local_5e8 & 0x1f);
      }
      bVar71 = bVar34 < 0x10;
    }
  }
  else {
    bVar71 = false;
  }
  if ((((x->e_mbd).cur_buf)->flags & 8) != 0) {
    bVar34 = (char)(x->e_mbd).bd * '\x02' - 0x10;
    uVar36 = (uint)(1 << (bVar34 & 0x1f)) >> 1;
    local_660 = (long)(local_660 + uVar36) >> (bVar34 & 0x3f);
    block_mse_q8 = uVar36 + block_mse_q8 >> (bVar34 & 0x1f);
  }
  uVar36 = (x->txfm_search_params).use_transform_domain_distortion;
  lVar52 = (long)(int)local_5e0;
  bVar70 = (ulong)block_mse_q8 <=
           lVar52 * lVar52 * (ulong)(x->txfm_search_params).coeff_opt_thresholds[0];
  if ((uVar36 == 0) || (block_mse_q8 < (x->txfm_search_params).tx_domain_dist_threshold)) {
    bVar23 = false;
  }
  else {
    bVar23 = (0x61810UL >> (local_730 & 0x3f) & 1) == 0 && (int)local_5c0 == 0;
  }
  local_6cc = 0.0;
  if ((uVar36 == 1) && (bVar23 != false)) {
    local_6cc = (float)(uint)(x->rd_model != '\x01');
  }
  if (SUB41(local_6cc,0) != 0) {
    bVar34 = ~bVar71 & (short)uVar65 != 1;
    local_6cc = (float)(uint)(SUB41(local_6cc,0) & bVar34);
    bVar23 = (bool)(bVar34 & bVar23);
  }
  lVar59 = local_660 * 0x10;
  puVar14 = pmVar1->eobs;
  lVar69 = 0;
  TVar126 = (TX_SIZE)local_730;
  av1_setup_xform(cm,x,TVar126,'\0',&txfm_param);
  pAVar22 = local_6e0;
  av1_setup_quant(TVar126,(uint)((bVar72 && skip_trellis == 0) && bVar70),
                  (uint)((!bVar72 || skip_trellis != 0) || !bVar70),
                  (local_6e0->oxcf).q_cfg.quant_b_adapt,&quant_param);
  local_6d8 = CONCAT44(local_6d8._4_4_,uVar65) & 0xffffffff0000ffff;
  pCVar63 = &(pAVar22->common).quant_params;
  local_5f8 = &x->plane[lVar66].coeff;
  local_570 = tx_size - 0x11;
  local_6e8 = (CommonQuantParams *)(long)block;
  local_618 = (tran_low_t *)((long)(block << 4) << 2);
  lVar48 = 0x7fffffffffffffff;
  local_5e8 = 0;
  uVar65 = 0;
  uVar3 = '\0';
  do {
    uVar36 = *(uint *)((long)&local_4c8 + lVar69 * 4);
    bVar71 = false;
    if (((uVar36 & 0xff) != 0xff) && (((uint)local_6d8 >> (uVar36 & 0x1f) & 1) != 0)) {
      TVar41 = (TX_TYPE)uVar36;
      txfm_param.tx_type = TVar41;
      local_5e0 = lVar48;
      _Var24 = av1_use_qmatrix(pCVar63,local_5c8,*(ushort *)&pMVar8->field_0xa7 & 7);
      if (_Var24) {
        av1_setup_qmatrix(pCVar63,local_5c8,plane,(TX_SIZE)local_730,TVar41,&quant_param);
      }
      if (plane == 0) {
        (x->e_mbd).tx_type_map[local_4d8] = TVar41;
      }
      ctxl[0] = -1;
      ctxl[1] = -1;
      ctxl[2] = -1;
      ctxl[3] = '\x7f';
      ctxl[4] = '\0';
      ctxl[5] = '\0';
      ctxl[6] = '\0';
      ctxl[7] = '\0';
      ctxl[8] = -1;
      ctxl[9] = -1;
      ctxl[10] = -1;
      ctxl[0xb] = -1;
      ctxl[0xc] = -1;
      ctxl[0xd] = -1;
      ctxl[0xe] = -1;
      ctxl[0xf] = '\x7f';
      ctxl[0x10] = -1;
      ctxl[0x11] = -1;
      ctxl[0x12] = -1;
      ctxl[0x13] = -1;
      ctxl[0x14] = -1;
      ctxl[0x15] = -1;
      ctxl[0x16] = -1;
      ctxl[0x17] = '\x7f';
      ctxl[0x18] = -1;
      ctxl[0x19] = -1;
      ctxl[0x1a] = -1;
      ctxl[0x1b] = -1;
      ctxl[0x1c] = -1;
      ctxl[0x1d] = -1;
      ctxl[0x1e] = -1;
      ctxl[0x1f] = '\x7f';
      if ((int)local_5c0 == 0) {
        av1_xform(x,plane,block,blk_row,blk_col,plane_bsize,&txfm_param);
      }
      else {
        av1_xform_dc_only(x,plane,block,&txfm_param,local_560);
      }
      uVar58 = (ulong)(x->txfm_search_params).coeff_opt_thresholds[1];
      if (uVar58 != 0xffffffff && ((bVar72 && skip_trellis == 0) && bVar70)) {
        if (((0xc < tx_size) || (iVar26 = 0x400, (0x1810U >> ((uint)local_730 & 0x1f) & 1) == 0)) &&
           (iVar26 = 0x200, 1 < local_570)) {
          iVar26 = tx_size_2d[local_730];
        }
        local_5d8 = CONCAT44(local_5d8._4_4_,iVar26);
        iVar26 = (local_6e0->oxcf).q_cfg.quant_b_adapt;
        ptVar67 = (tran_low_t *)((long)*local_5f8 + (long)local_618);
        iVar27 = av1_get_tx_scale((TX_SIZE)local_730);
        if ((int)local_5c0 == 0) {
          iVar28 = (*aom_satd)(ptVar67,(int)local_5d8);
        }
        else {
          iVar76 = *ptVar67;
          iVar28 = -iVar76;
          if (0 < iVar76) {
            iVar28 = iVar76;
          }
        }
        iVar76 = iVar28 >> (1U - (char)iVar27 & 0x1f);
        if (1 < iVar27) {
          iVar76 = iVar28 << ((char)iVar27 - 1U & 0x1f);
        }
        bVar71 = (long)sqrt_tx_pixels_2d[local_730] * uVar58 * lVar52 <
                 (ulong)(long)(iVar76 >> ((char)(x->e_mbd).bd - 8U & 0x1f));
        av1_setup_quant((TX_SIZE)local_730,(uint)!bVar71,(uint)bVar71,iVar26,&quant_param);
      }
      av1_quant(x,plane,block,&txfm_param,&quant_param);
      if (quant_param.use_optimize_b == 0) {
        rate_cost = av1_cost_coeffs_txb(x,plane,block,(TX_SIZE)local_730,TVar41,txb_ctx,
                                        (uint)(local_6e0->common).features.reduced_tx_set_used);
      }
      else {
        av1_optimize_b(local_6e0,x,plane,block,(TX_SIZE)local_730,TVar41,txb_ctx,&rate_cost);
      }
      bVar71 = false;
      lVar48 = local_5e0;
      if ((long)x->rdmult * (long)rate_cost + 0x100 >> 9 <= local_5e0) {
        if (puVar14[(long)local_6e8] == 0) {
          ctxl._24_8_ = lVar59;
          iVar32 = lVar59;
LAB_0023fe5d:
          ctxl._8_4_ = (undefined4)iVar32;
          ctxl._12_4_ = (undefined4)((ulong)iVar32 >> 0x20);
        }
        else {
          TVar126 = (TX_SIZE)local_730;
          if ((int)local_5c0 != 0) {
            ctxl._24_8_ = lVar59;
            iVar32 = dist_block_px_domain
                               (local_6e0,x,plane,plane_bsize,block,blk_row,blk_col,TVar126);
            goto LAB_0023fe5d;
          }
          if (bVar23 == false) {
            lVar48 = (long)tx_size_2d[local_730] * 0x4000;
            if ((tx_size == '\x04') || (lVar31 = 0x7fffffffffffffff, lVar48 <= lVar59)) {
              dist_block_tx_domain
                        (x,plane,block,TVar126,
                         (qm_val_t *)CONCAT44(quant_param.qmatrix._4_4_,quant_param.qmatrix._0_4_),
                         av1_scan_orders[txfm_param.tx_size][txfm_param._0_8_ & 0xff].scan,
                         (int64_t *)(ctxl + 8),(int64_t *)(ctxl + 0x18));
              lVar31 = lVar59 - ctxl._24_8_;
            }
            if (((tx_size == '\x04') && (lVar48 <= lVar59)) && ((long)ctxl._24_8_ <= lVar31 * 2)) {
              lVar31 = lVar31 + CONCAT44(ctxl._12_4_,ctxl._8_4_);
            }
            else {
              lVar31 = CONCAT44(ctxl._12_4_,ctxl._8_4_);
              iVar32 = dist_block_px_domain
                                 (local_6e0,x,plane,plane_bsize,block,blk_row,blk_col,
                                  (TX_SIZE)local_730);
              if (lVar31 < iVar32) {
                lVar31 = iVar32;
              }
              if (lVar59 < lVar48) {
                lVar31 = iVar32;
              }
            }
            ctxl._8_4_ = (undefined4)lVar31;
            ctxl._12_4_ = (undefined4)((ulong)lVar31 >> 0x20);
            ctxl._24_8_ = lVar59;
          }
          else {
            dist_block_tx_domain
                      (x,plane,block,TVar126,
                       (qm_val_t *)CONCAT44(quant_param.qmatrix._4_4_,quant_param.qmatrix._0_4_),
                       av1_scan_orders[txfm_param.tx_size][txfm_param._0_8_ & 0xff].scan,
                       (int64_t *)(ctxl + 8),(int64_t *)(ctxl + 0x18));
          }
        }
        ctxl[0] = (undefined1)rate_cost;
        ctxl[1] = rate_cost._1_1_;
        ctxl[2] = rate_cost._2_1_;
        ctxl[3] = rate_cost._3_1_;
        lVar31 = CONCAT44(ctxl._12_4_,ctxl._8_4_) * 0x80 +
                 ((long)x->rdmult * (long)rate_cost + 0x100 >> 9);
        lVar48 = local_5e0;
        if (lVar31 < local_5e0) {
          *(ulong *)&best_rd_stats->skip_txfm = (ulong)uStack_597 << 8;
          best_rd_stats->rdcost = ctxl._16_8_;
          best_rd_stats->sse = ctxl._24_8_;
          best_rd_stats->rate = rate_cost;
          *(ulong *)&best_rd_stats->zero_rate = CONCAT44(ctxl._8_4_,ctxl._4_4_);
          *(undefined4 *)((long)&best_rd_stats->dist + 4) = ctxl._12_4_;
          uVar3 = pmVar1->txb_entropy_ctx[(long)local_6e8];
          ptVar67 = pmVar1->dqcoeff;
          local_5e8 = (ulong)pmVar1->eobs[(long)local_6e8];
          pmVar1->dqcoeff = local_4d0;
          local_4d0 = ptVar67;
          lVar48 = lVar31;
          uVar65 = uVar36;
        }
        iVar26 = (local_6e0->sf).tx_sf.adaptive_txb_search_level;
        if ((iVar26 == 0) ||
           (bVar71 = true, lVar48 - (lVar48 >> ((byte)iVar26 & 0x3f)) <= ref_best_rd)) {
          bVar71 = (uint16_t)local_5e8 == 0 &&
                   (local_6e0->sf).tx_sf.tx_type_search.skip_tx_search != 0;
        }
      }
    }
  } while ((!bVar71) && (lVar69 = lVar69 + 1, lVar69 != 0x10));
  best_rd_stats->skip_txfm = (uint16_t)local_5e8 == 0;
  uVar39 = (uint8_t)uVar65;
  if (plane == 0) {
    iVar26 = (x->e_mbd).tx_type_map_stride;
    (x->e_mbd).tx_type_map[iVar26 * blk_row + blk_col] = uVar39;
    uVar58 = (ulong)(uint)((int)local_730 * 4);
    iVar27 = *(int *)((long)tx_size_wide_unit + uVar58);
    iVar28 = *(int *)((long)tx_size_high_unit + uVar58);
    if (((0x41010UL >> (local_730 & 0x3f) & 1) != 0) || ((0x20810UL >> (local_730 & 0x3f) & 1) != 0)
       ) {
      lVar52 = (long)blk_row * (long)iVar26 + (long)blk_col;
      lVar48 = 0;
      do {
        lVar69 = 0;
        do {
          (x->e_mbd).tx_type_map[lVar69 + lVar52] = uVar39;
          lVar69 = lVar69 + 4;
        } while (lVar69 < iVar27);
        lVar48 = lVar48 + 4;
        lVar52 = lVar52 + (long)iVar26 * 4;
      } while (lVar48 < iVar28);
    }
  }
  pmVar1->txb_entropy_ctx[(long)local_6e8] = uVar3;
  pmVar1->eobs[(long)local_6e8] = (uint16_t)local_5e8;
  pmVar1->dqcoeff = local_4d0;
  if ((SUB41(local_6cc,0) & (uint16_t)local_5e8 != 0) == 1) {
    iVar32 = dist_block_px_domain
                       (local_6e0,x,plane,plane_bsize,block,blk_row,blk_col,(TX_SIZE)local_730);
    best_rd_stats->dist = iVar32;
    best_rd_stats->sse = lVar59;
  }
  pMVar8 = *(x->e_mbd).mi;
  cVar43 = (char)*(ushort *)&pMVar8->field_0xa7;
  if (cVar43 < '\0') {
    bVar72 = false;
  }
  else {
    bVar72 = pMVar8->ref_frame[0] < '\x01';
  }
  if ((((uint16_t)local_5e8 == 0) || (!bVar72)) ||
     ((iVar26 = tx_size_high_unit[local_730],
      (int)(uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                 [uVar40] <= iVar26 + blk_row &&
      ((int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                  [uVar40] <= tx_size_wide_unit[local_730] + blk_col)))) goto LAB_002404c0;
  uVar25 = x->plane[lVar66].eobs[(long)local_6e8];
  if (uVar25 != 0) {
    iVar27 = (x->e_mbd).lossless[*(ushort *)&pMVar8->field_0xa7 & 7];
    if (iVar27 == 0) {
      if (plane == 0) {
        bVar34 = pMVar8->tx_size;
      }
      else {
        bVar4 = ""[av1_ss_size_lookup[pMVar8->bsize][(x->e_mbd).plane[local_488].subsampling_x]
                   [(x->e_mbd).plane[local_488].subsampling_y]];
        if (bVar4 < 0x11) {
          bVar34 = 3;
          if ((1 < bVar4 - 0xb) && (bVar4 != 4)) {
LAB_0024062a:
            bVar34 = bVar4;
          }
        }
        else if (bVar4 == 0x11) {
          bVar34 = 9;
        }
        else {
          if (bVar4 != 0x12) goto LAB_0024062a;
          bVar34 = 10;
        }
      }
    }
    else {
      bVar34 = 0;
    }
    _Var24 = (local_6e0->common).features.reduced_tx_set_used;
    local_618 = (tran_low_t *)((long)local_618 + (long)x->plane[lVar66].dqcoeff);
    uVar40 = (ulong)bVar34;
    if ((iVar27 == 0) && ((0x61810UL >> (uVar40 & 0x3f) & 1) == 0)) {
      if (plane == 0) {
        TVar41 = (x->e_mbd).tx_type_map[(x->e_mbd).tx_type_map_stride * blk_row + blk_col];
      }
      else {
        if ((cVar43 < '\0') || ('\0' < pMVar8->ref_frame[0])) {
          pbVar33 = (x->e_mbd).tx_type_map +
                    ((blk_row << ((byte)(x->e_mbd).plane[1].subsampling_y & 0x1f)) *
                     (x->e_mbd).tx_type_map_stride +
                    (blk_col << ((byte)(x->e_mbd).plane[1].subsampling_x & 0x1f)));
        }
        else {
          pbVar33 = intra_mode_to_tx_type__intra_mode_to_tx_type +
                    (byte)get_uv_mode_uv2y[pMVar8->uv_mode];
        }
        uVar65 = 1;
        if (-1 < cVar43) {
          uVar65 = (uint)('\0' < pMVar8->ref_frame[0]);
        }
        if ((0x18608UL >> (uVar40 & 0x3f) & 1) == 0) {
          if (_Var24 == false) {
            uVar65 = (uint)av1_ext_tx_set_lookup[0]
                           [(ulong)((0x60604UL >> (uVar40 & 0x3f) & 1) != 0) + (ulong)(uVar65 * 2)];
          }
          else {
            uVar65 = (uint)(byte)((uVar65 == 0) + 1);
          }
        }
        uVar65 = *(uint *)((long)av1_ext_tx_used[0] + (ulong)*pbVar33 * 4 + (ulong)(uVar65 << 6));
        if (uVar65 != 0) {
          uVar65 = (uint)*pbVar33;
        }
        TVar41 = (TX_TYPE)uVar65;
      }
    }
    else {
      TVar41 = '\0';
    }
    iVar27 = (x->e_mbd).plane[local_488].dst.stride;
    av1_inverse_transform_block
              (local_5c8,local_618,plane,TVar41,bVar34,
               (x->e_mbd).plane[local_488].dst.buf + (iVar27 * blk_row + blk_col) * 4,iVar27,
               (uint)uVar25,(uint)_Var24);
  }
  if (((plane == 0) && (uVar39 != '\0')) && (x->plane[lVar66].eobs[(long)local_6e8] == 0)) {
    iVar27 = (x->e_mbd).tx_type_map_stride;
    (x->e_mbd).tx_type_map[iVar27 * blk_row + blk_col] = '\0';
    iVar28 = tx_size_wide_unit[local_730];
    if (((0x41010UL >> (local_730 & 0x3f) & 1) != 0) || ((0x20810UL >> (local_730 & 0x3f) & 1) != 0)
       ) {
      lVar66 = (long)blk_row * (long)iVar27 + (long)blk_col;
      lVar52 = 0;
      do {
        lVar48 = 0;
        do {
          (x->e_mbd).tx_type_map[lVar48 + lVar66] = '\0';
          lVar48 = lVar48 + 4;
        } while (lVar48 < iVar28);
        lVar52 = lVar52 + 4;
        lVar66 = lVar66 + (long)iVar27 * 4;
      } while (lVar52 < iVar26);
    }
  }
LAB_002404c0:
  pmVar1->dqcoeff = local_440;
  return;
code_r0x0023d30d:
  lVar59 = lVar59 + 1;
  if (lVar52 == lVar59) goto LAB_0023d35b;
  goto LAB_0023d306;
code_r0x0023d758:
  uVar62 = uVar62 + 1;
  if (uVar58 == uVar62) goto LAB_0023d7b1;
  goto LAB_0023d74e;
code_r0x0023cdee:
  pCVar37 = (CommonQuantParams *)((long)&pCVar37->base_qindex + 1);
  if (pCVar30 == pCVar37) goto LAB_0023ce3d;
  goto LAB_0023cde4;
}

Assistant:

static void search_tx_type(const AV1_COMP *cpi, MACROBLOCK *x, int plane,
                           int block, int blk_row, int blk_col,
                           BLOCK_SIZE plane_bsize, TX_SIZE tx_size,
                           const TXB_CTX *const txb_ctx,
                           FAST_TX_SEARCH_MODE ftxs_mode, int skip_trellis,
                           int64_t ref_best_rd, RD_STATS *best_rd_stats) {
  const AV1_COMMON *cm = &cpi->common;
  MACROBLOCKD *xd = &x->e_mbd;
  MB_MODE_INFO *mbmi = xd->mi[0];
  const TxfmSearchParams *txfm_params = &x->txfm_search_params;
  int64_t best_rd = INT64_MAX;
  uint16_t best_eob = 0;
  TX_TYPE best_tx_type = DCT_DCT;
  int rate_cost = 0;
  struct macroblock_plane *const p = &x->plane[plane];
  tran_low_t *orig_dqcoeff = p->dqcoeff;
  tran_low_t *best_dqcoeff = x->dqcoeff_buf;
  const int tx_type_map_idx =
      plane ? 0 : blk_row * xd->tx_type_map_stride + blk_col;
  av1_invalid_rd_stats(best_rd_stats);

  skip_trellis |= !is_trellis_used(cpi->optimize_seg_arr[xd->mi[0]->segment_id],
                                   DRY_RUN_NORMAL);

  uint8_t best_txb_ctx = 0;
  // txk_allowed = TX_TYPES: >1 tx types are allowed
  // txk_allowed < TX_TYPES: only that specific tx type is allowed.
  TX_TYPE txk_allowed = TX_TYPES;
  int txk_map[TX_TYPES] = {
    0, 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15
  };
  const int dequant_shift = (is_cur_buf_hbd(xd)) ? xd->bd - 5 : 3;
  const int qstep = x->plane[plane].dequant_QTX[1] >> dequant_shift;

  const uint8_t txw = tx_size_wide[tx_size];
  const uint8_t txh = tx_size_high[tx_size];
  int64_t block_sse;
  unsigned int block_mse_q8;
  int dc_only_blk = 0;
  const bool predict_dc_block =
      txfm_params->predict_dc_level >= 1 && txw != 64 && txh != 64;
  int64_t per_px_mean = INT64_MAX;
  if (predict_dc_block) {
    predict_dc_only_block(x, plane, plane_bsize, tx_size, block, blk_row,
                          blk_col, best_rd_stats, &block_sse, &block_mse_q8,
                          &per_px_mean, &dc_only_blk);
    if (best_rd_stats->skip_txfm == 1) {
      const TX_TYPE tx_type = DCT_DCT;
      if (plane == 0) xd->tx_type_map[tx_type_map_idx] = tx_type;
      return;
    }
  } else {
    block_sse = av1_pixel_diff_dist(x, plane, blk_row, blk_col, plane_bsize,
                                    txsize_to_bsize[tx_size], &block_mse_q8);
    assert(block_mse_q8 != UINT_MAX);
  }

  // Bit mask to indicate which transform types are allowed in the RD search.
  uint16_t tx_mask;

  // Use DCT_DCT transform for DC only block.
  if (dc_only_blk || cpi->sf.rt_sf.dct_only_palette_nonrd == 1)
    tx_mask = 1 << DCT_DCT;
  else
    tx_mask = get_tx_mask(cpi, x, plane, block, blk_row, blk_col, plane_bsize,
                          tx_size, txb_ctx, ftxs_mode, ref_best_rd,
                          &txk_allowed, txk_map);
  const uint16_t allowed_tx_mask = tx_mask;

  if (is_cur_buf_hbd(xd)) {
    block_sse = ROUND_POWER_OF_TWO(block_sse, (xd->bd - 8) * 2);
    block_mse_q8 = ROUND_POWER_OF_TWO(block_mse_q8, (xd->bd - 8) * 2);
  }
  block_sse *= 16;
  // Use mse / qstep^2 based threshold logic to take decision of R-D
  // optimization of coeffs. For smaller residuals, coeff optimization
  // would be helpful. For larger residuals, R-D optimization may not be
  // effective.
  // TODO(any): Experiment with variance and mean based thresholds
  const int perform_block_coeff_opt =
      ((uint64_t)block_mse_q8 <=
       (uint64_t)txfm_params->coeff_opt_thresholds[0] * qstep * qstep);
  skip_trellis |= !perform_block_coeff_opt;

  // Flag to indicate if distortion should be calculated in transform domain or
  // not during iterating through transform type candidates.
  // Transform domain distortion is accurate for higher residuals.
  // TODO(any): Experiment with variance and mean based thresholds
  int use_transform_domain_distortion =
      (txfm_params->use_transform_domain_distortion > 0) &&
      (block_mse_q8 >= txfm_params->tx_domain_dist_threshold) &&
      // Any 64-pt transforms only preserves half the coefficients.
      // Therefore transform domain distortion is not valid for these
      // transform sizes.
      (txsize_sqr_up_map[tx_size] != TX_64X64) &&
      // Use pixel domain distortion for DC only blocks
      !dc_only_blk;
  // Flag to indicate if an extra calculation of distortion in the pixel domain
  // should be performed at the end, after the best transform type has been
  // decided.
  int calc_pixel_domain_distortion_final =
      txfm_params->use_transform_domain_distortion == 1 &&
      use_transform_domain_distortion && x->rd_model != LOW_TXFM_RD;
  if (calc_pixel_domain_distortion_final &&
      (txk_allowed < TX_TYPES || allowed_tx_mask == 0x0001))
    calc_pixel_domain_distortion_final = use_transform_domain_distortion = 0;

  const uint16_t *eobs_ptr = x->plane[plane].eobs;

  TxfmParam txfm_param;
  QUANT_PARAM quant_param;
  int skip_trellis_based_on_satd[TX_TYPES] = { 0 };
  av1_setup_xform(cm, x, tx_size, DCT_DCT, &txfm_param);
  av1_setup_quant(tx_size, !skip_trellis,
                  skip_trellis ? (USE_B_QUANT_NO_TRELLIS ? AV1_XFORM_QUANT_B
                                                         : AV1_XFORM_QUANT_FP)
                               : AV1_XFORM_QUANT_FP,
                  cpi->oxcf.q_cfg.quant_b_adapt, &quant_param);

  // Iterate through all transform type candidates.
  for (int idx = 0; idx < TX_TYPES; ++idx) {
    const TX_TYPE tx_type = (TX_TYPE)txk_map[idx];
    if (tx_type == TX_TYPE_INVALID || !check_bit_mask(allowed_tx_mask, tx_type))
      continue;
    txfm_param.tx_type = tx_type;
    if (av1_use_qmatrix(&cm->quant_params, xd, mbmi->segment_id)) {
      av1_setup_qmatrix(&cm->quant_params, xd, plane, tx_size, tx_type,
                        &quant_param);
    }
    if (plane == 0) xd->tx_type_map[tx_type_map_idx] = tx_type;
    RD_STATS this_rd_stats;
    av1_invalid_rd_stats(&this_rd_stats);

    if (!dc_only_blk)
      av1_xform(x, plane, block, blk_row, blk_col, plane_bsize, &txfm_param);
    else
      av1_xform_dc_only(x, plane, block, &txfm_param, per_px_mean);

    skip_trellis_based_on_satd[tx_type] = skip_trellis_opt_based_on_satd(
        x, &quant_param, plane, block, tx_size, cpi->oxcf.q_cfg.quant_b_adapt,
        qstep, txfm_params->coeff_opt_thresholds[1], skip_trellis, dc_only_blk);

    av1_quant(x, plane, block, &txfm_param, &quant_param);

    // Calculate rate cost of quantized coefficients.
    if (quant_param.use_optimize_b) {
      // TODO(aomedia:3209): update Trellis quantization to take into account
      // quantization matrices.
      av1_optimize_b(cpi, x, plane, block, tx_size, tx_type, txb_ctx,
                     &rate_cost);
    } else {
      rate_cost = cost_coeffs(x, plane, block, tx_size, tx_type, txb_ctx,
                              cm->features.reduced_tx_set_used);
    }

    // If rd cost based on coeff rate alone is already more than best_rd,
    // terminate early.
    if (RDCOST(x->rdmult, rate_cost, 0) > best_rd) continue;

    // Calculate distortion.
    if (eobs_ptr[block] == 0) {
      // When eob is 0, pixel domain distortion is more efficient and accurate.
      this_rd_stats.dist = this_rd_stats.sse = block_sse;
    } else if (dc_only_blk) {
      this_rd_stats.sse = block_sse;
      this_rd_stats.dist = dist_block_px_domain(
          cpi, x, plane, plane_bsize, block, blk_row, blk_col, tx_size);
    } else if (use_transform_domain_distortion) {
      const SCAN_ORDER *const scan_order =
          get_scan(txfm_param.tx_size, txfm_param.tx_type);
      dist_block_tx_domain(x, plane, block, tx_size, quant_param.qmatrix,
                           scan_order->scan, &this_rd_stats.dist,
                           &this_rd_stats.sse);
    } else {
      int64_t sse_diff = INT64_MAX;
      // high_energy threshold assumes that every pixel within a txfm block
      // has a residue energy of at least 25% of the maximum, i.e. 128 * 128
      // for 8 bit.
      const int64_t high_energy_thresh =
          ((int64_t)128 * 128 * tx_size_2d[tx_size]);
      const int is_high_energy = (block_sse >= high_energy_thresh);
      if (tx_size == TX_64X64 || is_high_energy) {
        // Because 3 out 4 quadrants of transform coefficients are forced to
        // zero, the inverse transform has a tendency to overflow. sse_diff
        // is effectively the energy of those 3 quadrants, here we use it
        // to decide if we should do pixel domain distortion. If the energy
        // is mostly in first quadrant, then it is unlikely that we have
        // overflow issue in inverse transform.
        const SCAN_ORDER *const scan_order =
            get_scan(txfm_param.tx_size, txfm_param.tx_type);
        dist_block_tx_domain(x, plane, block, tx_size, quant_param.qmatrix,
                             scan_order->scan, &this_rd_stats.dist,
                             &this_rd_stats.sse);
        sse_diff = block_sse - this_rd_stats.sse;
      }
      if (tx_size != TX_64X64 || !is_high_energy ||
          (sse_diff * 2) < this_rd_stats.sse) {
        const int64_t tx_domain_dist = this_rd_stats.dist;
        this_rd_stats.dist = dist_block_px_domain(
            cpi, x, plane, plane_bsize, block, blk_row, blk_col, tx_size);
        // For high energy blocks, occasionally, the pixel domain distortion
        // can be artificially low due to clamping at reconstruction stage
        // even when inverse transform output is hugely different from the
        // actual residue.
        if (is_high_energy && this_rd_stats.dist < tx_domain_dist)
          this_rd_stats.dist = tx_domain_dist;
      } else {
        assert(sse_diff < INT64_MAX);
        this_rd_stats.dist += sse_diff;
      }
      this_rd_stats.sse = block_sse;
    }

    this_rd_stats.rate = rate_cost;

    const int64_t rd =
        RDCOST(x->rdmult, this_rd_stats.rate, this_rd_stats.dist);

    if (rd < best_rd) {
      best_rd = rd;
      *best_rd_stats = this_rd_stats;
      best_tx_type = tx_type;
      best_txb_ctx = x->plane[plane].txb_entropy_ctx[block];
      best_eob = x->plane[plane].eobs[block];
      // Swap dqcoeff buffers
      tran_low_t *const tmp_dqcoeff = best_dqcoeff;
      best_dqcoeff = p->dqcoeff;
      p->dqcoeff = tmp_dqcoeff;
    }

#if CONFIG_COLLECT_RD_STATS == 1
    if (plane == 0) {
      PrintTransformUnitStats(cpi, x, &this_rd_stats, blk_row, blk_col,
                              plane_bsize, tx_size, tx_type, rd);
    }
#endif  // CONFIG_COLLECT_RD_STATS == 1

#if COLLECT_TX_SIZE_DATA
    // Generate small sample to restrict output size.
    static unsigned int seed = 21743;
    if (lcg_rand16(&seed) % 200 == 0) {
      FILE *fp = NULL;

      if (within_border) {
        fp = fopen(av1_tx_size_data_output_file, "a");
      }

      if (fp) {
        // Transform info and RD
        const int txb_w = tx_size_wide[tx_size];
        const int txb_h = tx_size_high[tx_size];

        // Residue signal.
        const int diff_stride = block_size_wide[plane_bsize];
        struct macroblock_plane *const p = &x->plane[plane];
        const int16_t *src_diff =
            &p->src_diff[(blk_row * diff_stride + blk_col) * 4];

        for (int r = 0; r < txb_h; ++r) {
          for (int c = 0; c < txb_w; ++c) {
            fprintf(fp, "%d,", src_diff[c]);
          }
          src_diff += diff_stride;
        }

        fprintf(fp, "%d,%d,%d,%" PRId64, txb_w, txb_h, tx_type, rd);
        fprintf(fp, "\n");
        fclose(fp);
      }
    }
#endif  // COLLECT_TX_SIZE_DATA

    // If the current best RD cost is much worse than the reference RD cost,
    // terminate early.
    if (cpi->sf.tx_sf.adaptive_txb_search_level) {
      if ((best_rd - (best_rd >> cpi->sf.tx_sf.adaptive_txb_search_level)) >
          ref_best_rd) {
        break;
      }
    }

    // Terminate transform type search if the block has been quantized to
    // all zero.
    if (cpi->sf.tx_sf.tx_type_search.skip_tx_search && !best_eob) break;
  }

  assert(best_rd != INT64_MAX);

  best_rd_stats->skip_txfm = best_eob == 0;
  if (plane == 0) update_txk_array(xd, blk_row, blk_col, tx_size, best_tx_type);
  x->plane[plane].txb_entropy_ctx[block] = best_txb_ctx;
  x->plane[plane].eobs[block] = best_eob;
  skip_trellis = skip_trellis_based_on_satd[best_tx_type];

  // Point dqcoeff to the quantized coefficients corresponding to the best
  // transform type, then we can skip transform and quantization, e.g. in the
  // final pixel domain distortion calculation and recon_intra().
  p->dqcoeff = best_dqcoeff;

  if (calc_pixel_domain_distortion_final && best_eob) {
    best_rd_stats->dist = dist_block_px_domain(
        cpi, x, plane, plane_bsize, block, blk_row, blk_col, tx_size);
    best_rd_stats->sse = block_sse;
  }

  // Intra mode needs decoded pixels such that the next transform block
  // can use them for prediction.
  recon_intra(cpi, x, plane, block, blk_row, blk_col, plane_bsize, tx_size,
              txb_ctx, skip_trellis, best_tx_type, 0, &rate_cost, best_eob);
  p->dqcoeff = orig_dqcoeff;
}